

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_fma::forward_inplace(Mish_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [24];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [24];
  long *in_RSI;
  float fVar132;
  float fVar133;
  undefined1 auVar131 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 two;
  __m256 one_2;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 two_1;
  __m128 one_7;
  v4sf y_4;
  v4sf z_1;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_3;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_5;
  undefined8 local_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  int local_36f8;
  undefined8 local_36e8;
  undefined8 local_36e0;
  undefined8 local_36d8;
  undefined4 local_36d0;
  long local_36c8;
  undefined4 local_36c0;
  undefined4 local_36bc;
  undefined4 local_36b8;
  undefined4 local_36b4;
  undefined4 local_36b0;
  undefined8 local_36a8;
  undefined1 (*local_36a0) [32];
  int local_3694;
  int local_3690;
  int local_368c;
  int local_3688;
  int local_3684;
  int local_3680;
  int local_367c;
  long *local_3670;
  undefined1 local_365d;
  int local_365c;
  undefined8 *local_3650;
  undefined8 *local_3648;
  undefined8 *local_3638;
  undefined1 (*local_3628) [32];
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined1 (*local_35d0) [32];
  undefined1 (*local_35c8) [32];
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 local_35b0;
  undefined8 uStack_35a8;
  undefined1 (*local_3598) [32];
  long local_3590;
  undefined4 local_3584;
  long local_3580;
  undefined1 (*local_3578) [32];
  undefined4 local_356c;
  int local_3568;
  int local_3564;
  undefined8 *local_3560;
  undefined4 local_3554;
  long local_3550;
  undefined8 *local_3530;
  undefined1 local_3500 [8];
  float fStack_34f8;
  float fStack_34f4;
  undefined1 local_34e0 [8];
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  undefined4 uStack_34c4;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined1 local_3420 [8];
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  ulong uStack_3408;
  float local_3400;
  float fStack_33fc;
  float fStack_33f8;
  float fStack_33f4;
  float fStack_33f0;
  float fStack_33ec;
  float fStack_33e8;
  float fStack_33e4;
  undefined1 local_33e0 [32];
  undefined1 local_33c0 [32];
  undefined1 local_33a0 [8];
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined1 local_3380 [32];
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined1 local_3320 [8];
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  ulong uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined1 local_3120 [8];
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined1 local_3100 [32];
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined1 local_30a0 [32];
  undefined1 local_3080 [8];
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined1 local_3060 [32];
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined4 local_2f6c;
  undefined4 local_2f68;
  undefined4 local_2f64;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined1 local_2f20 [32];
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  float local_2ee0;
  float fStack_2edc;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  undefined4 uStack_2ec4;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined1 local_2e60 [8];
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined1 local_2e40 [32];
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [8];
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined1 local_2da0 [32];
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined4 local_2ca4;
  float local_2ca0;
  float fStack_2c9c;
  float fStack_2c98;
  float fStack_2c94;
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  float fStack_2c84;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined1 local_2ba0 [32];
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 local_2970 [16];
  undefined1 local_2960 [16];
  undefined4 local_2944;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined1 *local_2610;
  undefined1 *local_2608;
  undefined1 *local_2600;
  float *local_25f8;
  undefined1 *local_25f0;
  undefined1 *local_25e8;
  float *local_25e0;
  undefined1 *local_25d8;
  undefined1 *local_25d0;
  float *local_25c8;
  undefined1 *local_25c0;
  undefined1 *local_25b8;
  float *local_25b0;
  undefined1 *local_25a8;
  undefined1 *local_25a0;
  float *local_2598;
  undefined1 *local_2590;
  undefined1 *local_2588;
  float *local_2580;
  float *local_2578;
  undefined1 *local_2570;
  undefined1 *local_2568;
  undefined1 *local_2560;
  undefined1 *local_2558;
  float *local_2550;
  undefined1 *local_2548;
  undefined1 *local_2540;
  float *local_2538;
  undefined1 *local_2530;
  undefined1 *local_2528;
  float *local_2520;
  undefined1 *local_2518;
  undefined1 *local_2510;
  float *local_2508;
  undefined1 *local_2500;
  undefined1 *local_24f8;
  float *local_24f0;
  undefined1 *local_24e8;
  undefined1 *local_24e0;
  float *local_24d8;
  float *local_24d0;
  undefined1 *local_24c8;
  undefined1 *local_24c0;
  float *local_24b8;
  undefined1 *local_24b0;
  undefined1 *local_24a8;
  float *local_24a0;
  undefined1 *local_2498;
  float *local_2490;
  undefined1 *local_2488;
  undefined1 *local_2480;
  float *local_2478;
  undefined1 *local_2470;
  undefined1 *local_2468;
  float *local_2460;
  undefined1 *local_2458;
  undefined1 *local_2450;
  float *local_2448;
  undefined1 *local_2440;
  undefined1 *local_2438;
  float *local_2430;
  undefined1 *local_2428;
  undefined1 *local_2420;
  float *local_2418;
  undefined1 *local_2410;
  undefined1 *local_2408;
  float *local_2400;
  undefined1 *local_23f8;
  undefined1 *local_23f0;
  float *local_23e8;
  undefined1 *local_23e0;
  undefined1 *local_23d8;
  undefined1 *local_23d0;
  float *local_23c8;
  undefined1 *local_23c0;
  undefined1 *local_23b8;
  float *local_23b0;
  undefined1 *local_23a8;
  undefined1 *local_23a0;
  float *local_2398;
  undefined1 *local_2390;
  undefined1 *local_2388;
  float *local_2380;
  undefined1 *local_2378;
  undefined1 *local_2370;
  float *local_2368;
  float *local_2360;
  undefined4 local_2354;
  undefined8 local_2350;
  undefined8 uStack_2348;
  undefined4 local_2334;
  undefined8 local_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 local_22f0;
  undefined8 uStack_22e8;
  float local_22e0 [2];
  float afStack_22d8 [2];
  float afStack_22d0 [2];
  float afStack_22c8 [2];
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280 [2];
  float afStack_2278 [2];
  float afStack_2270 [2];
  float afStack_2268 [2];
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  float local_2220 [2];
  float afStack_2218 [2];
  float afStack_2210 [2];
  float afStack_2208 [2];
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  float local_21c0 [2];
  float afStack_21b8 [2];
  float afStack_21b0 [2];
  float afStack_21a8 [2];
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  float local_2160 [2];
  float afStack_2158 [2];
  float afStack_2150 [2];
  float afStack_2148 [2];
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  float local_2100 [2];
  float afStack_20f8 [2];
  float afStack_20f0 [2];
  float afStack_20e8 [2];
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  float local_20a0 [2];
  float afStack_2098 [2];
  float afStack_2090 [2];
  float afStack_2088 [2];
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  float local_2040 [2];
  float afStack_2038 [2];
  float afStack_2030 [2];
  float afStack_2028 [2];
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  ulong uStack_1fc8;
  float local_1fc0 [2];
  float afStack_1fb8 [2];
  float afStack_1fb0 [2];
  float afStack_1fa8 [2];
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  float local_1f60 [2];
  float afStack_1f58 [2];
  float afStack_1f50 [2];
  float afStack_1f48 [2];
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  float local_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  float local_1f00 [2];
  float afStack_1ef8 [2];
  float afStack_1ef0 [2];
  float afStack_1ee8 [2];
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  float local_1ec0 [2];
  float afStack_1eb8 [2];
  float afStack_1eb0 [2];
  float afStack_1ea8 [2];
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60 [2];
  float afStack_1e58 [2];
  float afStack_1e50 [2];
  float afStack_1e48 [2];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00 [2];
  float afStack_1df8 [2];
  float afStack_1df0 [2];
  float afStack_1de8 [2];
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float local_1da0 [2];
  float afStack_1d98 [2];
  float afStack_1d90 [2];
  float afStack_1d88 [2];
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  float local_1d40 [2];
  float afStack_1d38 [2];
  float afStack_1d30 [2];
  float afStack_1d28 [2];
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  float local_1c80 [2];
  float afStack_1c78 [2];
  float afStack_1c70 [2];
  float afStack_1c68 [2];
  float local_1c60 [2];
  float afStack_1c58 [2];
  float afStack_1c50 [2];
  float afStack_1c48 [2];
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  float local_1c20 [2];
  float afStack_1c18 [2];
  float afStack_1c10 [2];
  float afStack_1c08 [2];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  float local_1bc0 [2];
  float afStack_1bb8 [2];
  float afStack_1bb0 [2];
  float afStack_1ba8 [2];
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  float local_1b60 [2];
  float afStack_1b58 [2];
  float afStack_1b50 [2];
  float afStack_1b48 [2];
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  float local_1b00 [2];
  float afStack_1af8 [2];
  float afStack_1af0 [2];
  float afStack_1ae8 [2];
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  float local_1aa0 [2];
  float afStack_1a98 [2];
  float afStack_1a90 [2];
  float afStack_1a88 [2];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0 [2];
  float afStack_19b8 [2];
  float afStack_19b0 [2];
  float afStack_19a8 [2];
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960 [2];
  float afStack_1958 [2];
  float afStack_1950 [2];
  float afStack_1948 [2];
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float local_1900 [2];
  float afStack_18f8 [2];
  float afStack_18f0 [2];
  float afStack_18e8 [2];
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  float local_18a0 [2];
  float afStack_1898 [2];
  float afStack_1890 [2];
  float afStack_1888 [2];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  float local_1840 [2];
  float afStack_1838 [2];
  float afStack_1830 [2];
  float afStack_1828 [2];
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined1 local_16a0 [16];
  undefined1 local_1690 [16];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined4 local_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined4 local_13e4;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined4 local_12f4;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined4 local_12d4;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined4 local_12b4;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined4 local_1294;
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [16];
  undefined1 auStack_1270 [16];
  undefined4 local_1260;
  undefined4 local_125c;
  undefined4 local_1258;
  undefined4 local_1254;
  undefined4 local_1250;
  undefined4 local_124c;
  undefined4 local_1248;
  undefined4 local_1244;
  undefined1 local_1240 [16];
  undefined1 auStack_1230 [16];
  undefined4 local_1220;
  undefined4 local_121c;
  undefined4 local_1218;
  undefined4 local_1214;
  undefined4 local_1210;
  undefined4 local_120c;
  undefined4 local_1208;
  undefined4 local_1204;
  undefined1 local_1200 [16];
  undefined1 auStack_11f0 [16];
  undefined4 local_11e0;
  undefined4 local_11dc;
  undefined4 local_11d8;
  undefined4 local_11d4;
  undefined4 local_11d0;
  undefined4 local_11cc;
  undefined4 local_11c8;
  undefined4 local_11c4;
  undefined1 local_11c0 [16];
  undefined1 auStack_11b0 [16];
  undefined4 local_1190;
  undefined4 local_118c;
  undefined4 local_1188;
  undefined4 local_1184;
  undefined4 local_1180;
  undefined4 local_117c;
  undefined4 local_1178;
  undefined4 local_1174;
  undefined1 local_1170 [8];
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [8];
  float fStack_1158;
  float fStack_1154;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined1 local_1110 [8];
  float fStack_1108;
  float fStack_1104;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [8];
  undefined8 uStack_10d8;
  float local_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined1 local_10c0 [16];
  undefined1 local_10b0 [16];
  undefined1 local_10a0 [8];
  undefined8 uStack_1098;
  undefined1 local_1090 [16];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined1 local_1070 [16];
  undefined1 local_1060 [8];
  undefined8 uStack_1058;
  undefined4 local_1044;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 local_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined1 local_f20 [8];
  undefined8 uStack_f18;
  undefined1 local_f10 [16];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined1 local_ef0 [16];
  undefined1 local_ee0 [8];
  undefined8 uStack_ed8;
  undefined1 local_ed0 [8];
  undefined8 uStack_ec8;
  undefined1 local_ec0 [16];
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined4 local_e84;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined4 local_dd0;
  undefined4 uStack_dcc;
  undefined4 uStack_dc8;
  undefined4 uStack_dc4;
  undefined4 local_db4;
  undefined4 local_db0;
  undefined4 uStack_dac;
  undefined4 uStack_da8;
  undefined4 uStack_da4;
  undefined4 local_d94;
  undefined4 local_d90;
  undefined4 uStack_d8c;
  undefined4 uStack_d88;
  undefined4 uStack_d84;
  undefined4 local_d74;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined1 local_d50 [16];
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [16];
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined1 local_cc0 [16];
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [8];
  undefined8 uStack_c98;
  undefined1 local_c90 [16];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined1 local_c70 [16];
  undefined1 local_c60 [8];
  undefined8 uStack_c58;
  undefined1 local_c50 [8];
  undefined8 uStack_c48;
  undefined1 local_c40 [16];
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [16];
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined4 local_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b48;
  undefined4 uStack_b44;
  undefined4 local_b34;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  float *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  float *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  float *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  float *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  float *local_850;
  undefined1 *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  float *local_820;
  undefined1 *local_818;
  undefined1 *local_810;
  float *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  float *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  float *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  float *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  float *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  float *local_788;
  undefined1 *local_780;
  float *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  float *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  float *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  float *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  float *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  float *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  float *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  float *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  float *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  float *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  float *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  float *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  float *local_650;
  float *local_648;
  float local_640 [2];
  float afStack_638 [2];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  float local_610 [2];
  float afStack_608 [2];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  float local_5e0 [2];
  float afStack_5d8 [2];
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  float local_5b0 [2];
  float afStack_5a8 [2];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  float local_580 [2];
  float afStack_578 [2];
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float local_550 [2];
  float afStack_548 [2];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  float local_520 [2];
  float afStack_518 [2];
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  float local_4f0 [2];
  float afStack_4e8 [2];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  float local_4b0 [2];
  float afStack_4a8 [2];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  float local_480 [2];
  float afStack_478 [2];
  undefined8 local_470;
  undefined8 uStack_468;
  float local_460 [2];
  float afStack_458 [2];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  float local_430 [2];
  float afStack_428 [2];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  float local_400 [2];
  float afStack_3f8 [2];
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  float local_3d0 [2];
  float afStack_3c8 [2];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  float local_3a0 [2];
  float afStack_398 [2];
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_340 [2];
  float afStack_338 [2];
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  float local_310 [2];
  float afStack_308 [2];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_2b0 [2];
  float afStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  float local_280 [2];
  float afStack_278 [2];
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_367c = *(int *)((long)in_RSI + 0x2c);
  local_3680 = (int)in_RSI[6];
  local_3684 = *(int *)((long)in_RSI + 0x34);
  local_3688 = (int)in_RSI[7];
  local_368c = (int)in_RSI[3];
  local_3690 = local_367c * local_3680 * local_3684 * local_368c;
  local_3670 = in_RSI;
  for (local_3694 = 0; local_3694 < local_3688; local_3694 = local_3694 + 1) {
    local_3650 = &local_36e8;
    local_3564 = *(int *)((long)local_3670 + 0x2c);
    local_3568 = (int)local_3670[6];
    local_356c = *(undefined4 *)((long)local_3670 + 0x34);
    local_3578 = (undefined1 (*) [32])
                 (*local_3670 + local_3670[8] * (long)local_3694 * local_3670[2]);
    local_3580 = local_3670[2];
    local_3584 = (undefined4)local_3670[3];
    local_3590 = local_3670[4];
    local_3560 = &local_36e8;
    local_3550 = (long)local_3564 * (long)local_3568 * local_3580;
    local_3648 = &local_36e8;
    local_3638 = &local_36e8;
    local_3554 = 0x10;
    local_365c = local_3694;
    local_365d = 1;
    local_36e8 = 0;
    local_36d8 = 0;
    local_36d0 = 0;
    local_36c0 = 0;
    local_36bc = 0;
    local_36b8 = 0;
    local_36b4 = 0;
    local_36b0 = 0;
    local_36a8 = 0;
    local_36e0 = 0;
    local_36a0 = local_3578;
    for (local_36f8 = 0; local_36f8 + 7 < local_3690; local_36f8 = local_36f8 + 8) {
      local_3628 = local_36a0;
      local_3620 = *(undefined8 *)*local_36a0;
      uStack_3618 = *(undefined8 *)(*local_36a0 + 8);
      uStack_3610 = *(undefined8 *)(*local_36a0 + 0x10);
      auVar126 = *(undefined1 (*) [24])*local_36a0;
      uStack_3608 = *(undefined8 *)(*local_36a0 + 0x18);
      auVar127 = *local_36a0;
      local_2ae0 = ZEXT1632(ZEXT816(0) << 0x40);
      local_3360 = 0x3f8000003f800000;
      uStack_3358 = 0x3f8000003f800000;
      uStack_3350 = 0x3f8000003f800000;
      uStack_3348 = 0x3f8000003f800000;
      local_3060._0_8_ = auVar126._0_8_;
      local_17a0 = local_3060._0_8_;
      local_3060._8_8_ = auVar126._8_8_;
      uStack_1798 = local_3060._8_8_;
      local_3060._16_8_ = auVar126._16_8_;
      uStack_1790 = local_3060._16_8_;
      local_1800 = 0x42b0c0a542b0c0a5;
      uStack_17f8 = 0x42b0c0a542b0c0a5;
      uStack_17f0 = 0x42b0c0a542b0c0a5;
      uStack_17e8 = 0x42b0c0a542b0c0a5;
      auVar66._8_8_ = 0x42b0c0a542b0c0a5;
      auVar66._0_8_ = 0x42b0c0a542b0c0a5;
      auVar66._16_8_ = 0x42b0c0a542b0c0a5;
      auVar66._24_8_ = 0x42b0c0a542b0c0a5;
      auVar3 = vminps_avx(*local_36a0,auVar66);
      local_3060._0_8_ = auVar3._0_8_;
      local_2a40 = local_3060._0_8_;
      local_3060._8_8_ = auVar3._8_8_;
      uStack_2a38 = local_3060._8_8_;
      local_3060._16_8_ = auVar3._16_8_;
      uStack_2a30 = local_3060._16_8_;
      local_3060._24_8_ = auVar3._24_8_;
      uStack_2a28 = local_3060._24_8_;
      local_2aa0 = 0xc2b0c0a5c2b0c0a5;
      uStack_2a98 = 0xc2b0c0a5c2b0c0a5;
      uStack_2a90 = 0xc2b0c0a5c2b0c0a5;
      uStack_2a88 = 0xc2b0c0a5c2b0c0a5;
      auVar28._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar3,auVar28);
      local_2568 = local_3060;
      local_24d0 = ::_ps256_cephes_LOG2EF;
      local_24d8 = ::_ps256_0p5;
      local_3060._0_8_ = auVar2._0_8_;
      local_1ee0 = local_3060._0_8_;
      local_3060._8_8_ = auVar2._8_8_;
      uStack_1ed8 = local_3060._8_8_;
      local_3060._16_8_ = auVar2._16_8_;
      uStack_1ed0 = local_3060._16_8_;
      local_3060._24_8_ = auVar2._24_8_;
      uStack_1ec8 = local_3060._24_8_;
      local_1f00[0] = 1.442695;
      local_1f00[1] = 1.442695;
      afStack_1ef8[0] = 1.442695;
      afStack_1ef8[1] = 1.442695;
      afStack_1ef0[0] = 1.442695;
      afStack_1ef0[1] = 1.442695;
      afStack_1ee8[0] = 1.442695;
      afStack_1ee8[1] = 1.442695;
      local_1f20[0] = 0.5;
      local_1f20[1] = 0.5;
      afStack_1f18[0] = 0.5;
      afStack_1f18[1] = 0.5;
      afStack_1f10[0] = 0.5;
      afStack_1f10[1] = 0.5;
      afStack_1f08[0] = 0.5;
      afStack_1f08[1] = 0.5;
      auVar47._8_4_ = 1.442695;
      auVar47._12_4_ = 1.442695;
      auVar47._0_4_ = 1.442695;
      auVar47._4_4_ = 1.442695;
      auVar47._16_4_ = 1.442695;
      auVar47._20_4_ = 1.442695;
      auVar47._24_4_ = 1.442695;
      auVar47._28_4_ = 1.442695;
      auVar131._8_4_ = 0.5;
      auVar131._12_4_ = 0.5;
      auVar131._0_4_ = 0.5;
      auVar131._4_4_ = 0.5;
      auVar131._16_4_ = 0.5;
      auVar131._20_4_ = 0.5;
      auVar131._24_4_ = 0.5;
      auVar131._28_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(auVar47,auVar2,auVar131);
      auVar4 = vroundps_avx(ZEXT1632(auVar5),1);
      auVar3 = vcmpps_avx(ZEXT1632(auVar5),auVar4,1);
      local_3100._0_8_ = auVar3._0_8_;
      local_28a0 = local_3100._0_8_;
      local_3100._8_8_ = auVar3._8_8_;
      uStack_2898 = local_3100._8_8_;
      local_3100._16_8_ = auVar3._16_8_;
      uStack_2890 = local_3100._16_8_;
      local_3100._24_8_ = auVar3._24_8_;
      uStack_2888 = local_3100._24_8_;
      local_28c0 = 0x3f8000003f800000;
      uStack_28b8 = 0x3f8000003f800000;
      uStack_28b0 = 0x3f8000003f800000;
      uStack_28a8 = 0x3f8000003f800000;
      auVar32._8_8_ = 0x3f8000003f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._16_8_ = 0x3f8000003f800000;
      auVar32._24_8_ = 0x3f8000003f800000;
      local_3100 = vandps_avx(auVar3,auVar32);
      local_3080 = auVar4._0_8_;
      local_2bc0 = local_3080;
      uStack_3078 = auVar4._8_8_;
      uStack_2bb8 = uStack_3078;
      uStack_3070 = auVar4._16_8_;
      uStack_2bb0 = uStack_3070;
      uStack_3068 = auVar4._24_8_;
      uStack_2ba8 = uStack_3068;
      local_2be0 = local_3100._0_8_;
      uStack_2bd8 = local_3100._8_8_;
      uStack_2bd0 = local_3100._16_8_;
      uStack_2bc8 = local_3100._24_8_;
      local_30a0 = vsubps_avx(auVar4,local_3100);
      local_2390 = local_30a0;
      local_2380 = ::_ps256_cephes_exp_C1;
      local_1940 = local_30a0._0_8_;
      uStack_1938 = local_30a0._8_8_;
      uStack_1930 = local_30a0._16_8_;
      uStack_1928 = local_30a0._24_8_;
      local_1960[0] = 0.6933594;
      local_1960[1] = 0.6933594;
      afStack_1958[0] = 0.6933594;
      afStack_1958[1] = 0.6933594;
      afStack_1950[0] = 0.6933594;
      afStack_1950[1] = 0.6933594;
      afStack_1948[0] = 0.6933594;
      afStack_1948[1] = 0.6933594;
      local_1980 = local_3060._0_8_;
      uStack_1978 = local_3060._8_8_;
      uStack_1970 = local_3060._16_8_;
      uStack_1968 = local_3060._24_8_;
      auVar61._8_4_ = 0.6933594;
      auVar61._12_4_ = 0.6933594;
      auVar61._0_4_ = 0.6933594;
      auVar61._4_4_ = 0.6933594;
      auVar61._16_4_ = 0.6933594;
      auVar61._20_4_ = 0.6933594;
      auVar61._24_4_ = 0.6933594;
      auVar61._28_4_ = 0.6933594;
      auVar5 = vfnmadd213ps_fma(auVar61,local_30a0,auVar2);
      local_2398 = ::_ps256_cephes_exp_C2;
      local_18e0 = local_30a0._0_8_;
      uStack_18d8 = local_30a0._8_8_;
      uStack_18d0 = local_30a0._16_8_;
      uStack_18c8 = local_30a0._24_8_;
      local_1900[0] = -0.00021219444;
      local_1900[1] = -0.00021219444;
      afStack_18f8[0] = -0.00021219444;
      afStack_18f8[1] = -0.00021219444;
      afStack_18f0[0] = -0.00021219444;
      afStack_18f0[1] = -0.00021219444;
      afStack_18e8[0] = -0.00021219444;
      afStack_18e8[1] = -0.00021219444;
      local_3060._0_8_ = auVar5._0_8_;
      local_1920 = local_3060._0_8_;
      local_3060._8_8_ = auVar5._8_8_;
      uStack_1918 = local_3060._8_8_;
      uStack_1910 = 0;
      uStack_1908 = 0;
      auVar62._8_4_ = -0.00021219444;
      auVar62._12_4_ = -0.00021219444;
      auVar62._0_4_ = -0.00021219444;
      auVar62._4_4_ = -0.00021219444;
      auVar62._16_4_ = -0.00021219444;
      auVar62._20_4_ = -0.00021219444;
      auVar62._24_4_ = -0.00021219444;
      auVar62._28_4_ = -0.00021219444;
      auVar5 = vfnmadd213ps_fma(auVar62,local_30a0,ZEXT1632(auVar5));
      auVar131 = ZEXT1632(auVar5);
      local_3060._0_8_ = auVar5._0_8_;
      local_3000 = local_3060._0_8_;
      local_3060._8_8_ = auVar5._8_8_;
      uStack_2ff8 = local_3060._8_8_;
      uStack_2ff0 = 0;
      uStack_2fe8 = 0;
      local_2fe0._0_4_ = auVar5._0_4_;
      local_2fe0._4_4_ = auVar5._4_4_;
      uStack_2fd8._0_4_ = auVar5._8_4_;
      uStack_2fd8._4_4_ = auVar5._12_4_;
      local_3080._4_4_ = local_2fe0._4_4_ * local_2fe0._4_4_;
      local_3080._0_4_ = (float)local_2fe0 * (float)local_2fe0;
      local_1cc0 = local_3080;
      uStack_3078._0_4_ = (float)uStack_2fd8 * (float)uStack_2fd8;
      uStack_3078._4_4_ = uStack_2fd8._4_4_ * uStack_2fd8._4_4_;
      auVar6 = _local_3080;
      _local_3080 = ZEXT1632(_local_3080);
      auVar32 = _local_3080;
      uStack_3118 = 0x3950696739506967;
      local_3120 = (undefined1  [8])0x3950696739506967;
      uStack_3110 = 0x3950696739506967;
      uStack_3108 = 0x3950696739506967;
      local_2558 = local_3120;
      local_24f0 = ::_ps256_cephes_exp_p1;
      local_1e80 = 0x3950696739506967;
      uStack_1e78 = 0x3950696739506967;
      uStack_1e70 = 0x3950696739506967;
      uStack_1e68 = 0x3950696739506967;
      local_1ea0 = local_3060._0_8_;
      uStack_1e98 = local_3060._8_8_;
      uStack_1e90 = 0;
      uStack_1e88 = 0;
      local_1ec0[0] = 0.0013981999;
      local_1ec0[1] = 0.0013981999;
      afStack_1eb8[0] = 0.0013981999;
      afStack_1eb8[1] = 0.0013981999;
      afStack_1eb0[0] = 0.0013981999;
      afStack_1eb0[1] = 0.0013981999;
      afStack_1ea8[0] = 0.0013981999;
      afStack_1ea8[1] = 0.0013981999;
      auVar48._8_4_ = 0.0013981999;
      auVar48._12_4_ = 0.0013981999;
      auVar48._0_4_ = 0.0013981999;
      auVar48._4_4_ = 0.0013981999;
      auVar48._16_4_ = 0.0013981999;
      auVar48._20_4_ = 0.0013981999;
      auVar48._24_4_ = 0.0013981999;
      auVar48._28_4_ = 0.0013981999;
      auVar5 = vfmadd213ps_fma(auVar131,_local_3120,auVar48);
      local_2508 = ::_ps256_cephes_exp_p2;
      local_3120 = auVar5._0_8_;
      local_1e20 = local_3120;
      uStack_3118 = auVar5._8_8_;
      uStack_1e18 = uStack_3118;
      uStack_1e10 = 0;
      uStack_1e08 = 0;
      local_1e40 = local_3060._0_8_;
      uStack_1e38 = local_3060._8_8_;
      uStack_1e30 = 0;
      uStack_1e28 = 0;
      local_1e60[0] = 0.008333452;
      local_1e60[1] = 0.008333452;
      afStack_1e58[0] = 0.008333452;
      afStack_1e58[1] = 0.008333452;
      afStack_1e50[0] = 0.008333452;
      afStack_1e50[1] = 0.008333452;
      afStack_1e48[0] = 0.008333452;
      afStack_1e48[1] = 0.008333452;
      auVar49._8_4_ = 0.008333452;
      auVar49._12_4_ = 0.008333452;
      auVar49._0_4_ = 0.008333452;
      auVar49._4_4_ = 0.008333452;
      auVar49._16_4_ = 0.008333452;
      auVar49._20_4_ = 0.008333452;
      auVar49._24_4_ = 0.008333452;
      auVar49._28_4_ = 0.008333452;
      auVar5 = vfmadd213ps_fma(auVar131,ZEXT1632(auVar5),auVar49);
      local_2520 = ::_ps256_cephes_exp_p3;
      local_3120 = auVar5._0_8_;
      local_1dc0 = local_3120;
      uStack_3118 = auVar5._8_8_;
      uStack_1db8 = uStack_3118;
      uStack_1db0 = 0;
      uStack_1da8 = 0;
      local_1de0 = local_3060._0_8_;
      uStack_1dd8 = local_3060._8_8_;
      uStack_1dd0 = 0;
      uStack_1dc8 = 0;
      local_1e00[0] = 0.041665796;
      local_1e00[1] = 0.041665796;
      afStack_1df8[0] = 0.041665796;
      afStack_1df8[1] = 0.041665796;
      afStack_1df0[0] = 0.041665796;
      afStack_1df0[1] = 0.041665796;
      afStack_1de8[0] = 0.041665796;
      afStack_1de8[1] = 0.041665796;
      auVar50._8_4_ = 0.041665796;
      auVar50._12_4_ = 0.041665796;
      auVar50._0_4_ = 0.041665796;
      auVar50._4_4_ = 0.041665796;
      auVar50._16_4_ = 0.041665796;
      auVar50._20_4_ = 0.041665796;
      auVar50._24_4_ = 0.041665796;
      auVar50._28_4_ = 0.041665796;
      auVar5 = vfmadd213ps_fma(auVar131,ZEXT1632(auVar5),auVar50);
      local_2538 = ::_ps256_cephes_exp_p4;
      local_3120 = auVar5._0_8_;
      local_1d60 = local_3120;
      uStack_3118 = auVar5._8_8_;
      uStack_1d58 = uStack_3118;
      uStack_1d50 = 0;
      uStack_1d48 = 0;
      local_1d80 = local_3060._0_8_;
      uStack_1d78 = local_3060._8_8_;
      uStack_1d70 = 0;
      uStack_1d68 = 0;
      local_1da0[0] = 0.16666666;
      local_1da0[1] = 0.16666666;
      afStack_1d98[0] = 0.16666666;
      afStack_1d98[1] = 0.16666666;
      afStack_1d90[0] = 0.16666666;
      afStack_1d90[1] = 0.16666666;
      afStack_1d88[0] = 0.16666666;
      afStack_1d88[1] = 0.16666666;
      auVar51._8_4_ = 0.16666666;
      auVar51._12_4_ = 0.16666666;
      auVar51._0_4_ = 0.16666666;
      auVar51._4_4_ = 0.16666666;
      auVar51._16_4_ = 0.16666666;
      auVar51._20_4_ = 0.16666666;
      auVar51._24_4_ = 0.16666666;
      auVar51._28_4_ = 0.16666666;
      auVar5 = vfmadd213ps_fma(auVar131,ZEXT1632(auVar5),auVar51);
      local_2550 = ::_ps256_cephes_exp_p5;
      local_3120 = auVar5._0_8_;
      local_1d00 = local_3120;
      uStack_3118 = auVar5._8_8_;
      uStack_1cf8 = uStack_3118;
      uStack_1cf0 = 0;
      uStack_1ce8 = 0;
      local_1d20 = local_3060._0_8_;
      uStack_1d18 = local_3060._8_8_;
      uStack_1d10 = 0;
      uStack_1d08 = 0;
      local_1d40[0] = 0.5;
      local_1d40[1] = 0.5;
      afStack_1d38[0] = 0.5;
      afStack_1d38[1] = 0.5;
      afStack_1d30[0] = 0.5;
      afStack_1d30[1] = 0.5;
      afStack_1d28[0] = 0.5;
      afStack_1d28[1] = 0.5;
      auVar52._8_4_ = 0.5;
      auVar52._12_4_ = 0.5;
      auVar52._0_4_ = 0.5;
      auVar52._4_4_ = 0.5;
      auVar52._16_4_ = 0.5;
      auVar52._20_4_ = 0.5;
      auVar52._24_4_ = 0.5;
      auVar52._28_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(auVar131,ZEXT1632(auVar5),auVar52);
      local_2560 = local_3080;
      local_3120 = auVar5._0_8_;
      local_1ca0 = local_3120;
      uStack_3118 = auVar5._8_8_;
      uStack_1c98 = uStack_3118;
      uStack_1c90 = 0;
      uStack_1c88 = 0;
      uStack_3078 = auVar6._8_8_;
      uStack_1cb8 = uStack_3078;
      uStack_1cb0 = 0;
      uStack_1ca8 = 0;
      local_1ce0 = local_3060._0_8_;
      uStack_1cd8 = local_3060._8_8_;
      uStack_1cd0 = 0;
      uStack_1cc8 = 0;
      auVar5 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar5),auVar131);
      local_3120 = auVar5._0_8_;
      uVar7 = local_3120;
      uStack_3118 = auVar5._8_8_;
      uVar8 = uStack_3118;
      uStack_2f90 = 0;
      uStack_2f88 = 0;
      local_2fc0 = 0x3f8000003f800000;
      uStack_2fb8 = 0x3f8000003f800000;
      uStack_2fb0 = 0x3f8000003f800000;
      uStack_2fa8 = 0x3f8000003f800000;
      local_2fa0._0_4_ = auVar5._0_4_;
      local_2fa0._4_4_ = auVar5._4_4_;
      uStack_2f98._0_4_ = auVar5._8_4_;
      uStack_2f98._4_4_ = auVar5._12_4_;
      local_3120._4_4_ = local_2fa0._4_4_ + 1.0;
      local_3120._0_4_ = (float)local_2fa0 + 1.0;
      uStack_3118._0_4_ = (float)uStack_2f98 + 1.0;
      uStack_3118._4_4_ = uStack_2f98._4_4_ + 1.0;
      uStack_3110._0_4_ = 0x3f800000;
      uStack_3110._4_4_ = 0x3f800000;
      auVar130 = _local_3120;
      uStack_3108._0_4_ = 0x3f800000;
      uStack_3108._4_4_ = 0x3f800000;
      auVar3 = _local_3120;
      local_1760._0_4_ = local_30a0._0_4_;
      local_1760._4_4_ = local_30a0._4_4_;
      uStack_1758._0_4_ = local_30a0._8_4_;
      uStack_1758._4_4_ = local_30a0._12_4_;
      uStack_1750._0_4_ = local_30a0._16_4_;
      uStack_1750._4_4_ = local_30a0._20_4_;
      uStack_1748._0_4_ = local_30a0._24_4_;
      uStack_1748._4_4_ = local_30a0._28_4_;
      local_30c0 = CONCAT44((int)local_1760._4_4_,(int)(float)local_1760);
      uStack_30b8 = CONCAT44((int)uStack_1758._4_4_,(int)(float)uStack_1758);
      uStack_30b0 = CONCAT44((int)uStack_1750._4_4_,(int)(float)uStack_1750);
      uStack_30a8 = CONCAT44((int)uStack_1748._4_4_,(int)(float)uStack_1748);
      local_1560 = local_30c0;
      uStack_1558 = uStack_30b8;
      uStack_1550 = uStack_30b0;
      uStack_1548 = uStack_30a8;
      local_2680 = 0x7f0000007f;
      uStack_2678 = 0x7f0000007f;
      uStack_2670 = 0x7f0000007f;
      uStack_2668 = 0x7f0000007f;
      local_1600 = local_30c0;
      uStack_15f8 = uStack_30b8;
      uStack_15f0 = uStack_30b0;
      uStack_15e8 = uStack_30a8;
      local_1620 = 0x7f0000007f;
      uStack_1618 = 0x7f0000007f;
      uStack_1610 = 0x7f0000007f;
      uStack_1608 = 0x7f0000007f;
      local_15b0 = 0x7f0000007f;
      uStack_15a8 = 0x7f0000007f;
      local_15c0 = 0x7f0000007f;
      uStack_15b8 = 0x7f0000007f;
      local_1350 = local_30c0;
      uStack_1348 = uStack_30b8;
      local_1360 = 0x7f0000007f;
      uStack_1358 = 0x7f0000007f;
      auVar69._8_8_ = uStack_30b8;
      auVar69._0_8_ = local_30c0;
      auVar68._8_8_ = 0x7f0000007f;
      auVar68._0_8_ = 0x7f0000007f;
      local_1590 = vpaddd_avx(auVar68,auVar69);
      local_1370 = uStack_30b0;
      uStack_1368 = uStack_30a8;
      local_1380 = 0x7f0000007f;
      uStack_1378 = 0x7f0000007f;
      auVar67._8_8_ = uStack_30a8;
      auVar67._0_8_ = uStack_30b0;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_15a0 = vpaddd_avx(auVar1,auVar67);
      local_1640 = local_1590._0_8_;
      uStack_1638 = local_1590._8_8_;
      uStack_1630 = local_15a0._0_8_;
      uStack_1628 = local_15a0._8_8_;
      local_15e0 = local_1590._0_8_;
      uStack_15d8 = local_1590._8_8_;
      uStack_15d0 = local_15a0._0_8_;
      uStack_15c8 = local_15a0._8_8_;
      local_13e0 = local_1590._0_8_;
      uStack_13d8 = local_1590._8_8_;
      uStack_13d0 = local_15a0._0_8_;
      uStack_13c8 = local_15a0._8_8_;
      local_13e4 = 0x17;
      local_1460 = local_1590._0_8_;
      uStack_1458 = local_1590._8_8_;
      uStack_1450 = local_15a0._0_8_;
      uStack_1448 = local_15a0._8_8_;
      local_12d0 = local_1590._0_8_;
      uStack_12c8 = local_1590._8_8_;
      local_12d4 = 0x17;
      local_1400 = vpslld_avx(local_1590,ZEXT416(0x17));
      local_12f0 = local_15a0._0_8_;
      uStack_12e8 = local_15a0._8_8_;
      local_12f4 = 0x17;
      local_1410 = vpslld_avx(local_15a0,ZEXT416(0x17));
      local_1480 = local_1400._0_8_;
      uStack_1478 = local_1400._8_8_;
      uStack_1470 = local_1410._0_8_;
      uStack_1468 = local_1410._8_8_;
      local_1440 = local_1400._0_8_;
      uStack_1438 = local_1400._8_8_;
      uStack_1430 = local_1410._0_8_;
      uStack_1428 = local_1410._8_8_;
      local_30c0 = local_1400._0_8_;
      uStack_30b8 = local_1400._8_8_;
      uStack_30b0 = local_1410._0_8_;
      uStack_30a8 = local_1410._8_8_;
      local_13a0 = local_1400._0_8_;
      uStack_1398 = local_1400._8_8_;
      uStack_1390 = local_1410._0_8_;
      uStack_1388 = local_1410._8_8_;
      local_3140 = local_1400._0_8_;
      uStack_3138 = local_1400._8_8_;
      uStack_3130 = local_1410._0_8_;
      uStack_3128 = local_1410._8_8_;
      local_3020 = local_3120;
      uStack_3018 = uStack_3118;
      uStack_3110 = auVar130._16_8_;
      uStack_3010 = uStack_3110;
      uStack_3108 = auVar3._24_8_;
      uStack_3008 = uStack_3108;
      local_3040._0_4_ = local_1400._0_4_;
      local_3040._4_4_ = local_1400._4_4_;
      uStack_3038._0_4_ = local_1400._8_4_;
      uStack_3038._4_4_ = local_1400._12_4_;
      uStack_3030._0_4_ = local_1410._0_4_;
      uStack_3030._4_4_ = local_1410._4_4_;
      uStack_3028._0_4_ = local_1410._8_4_;
      local_3120._0_4_ = (float)local_3040 * ((float)local_2fa0 + 1.0);
      local_3120._4_4_ = local_3040._4_4_ * (local_2fa0._4_4_ + 1.0);
      uStack_3038._0_4_ = (float)uStack_3038 * ((float)uStack_2f98 + 1.0);
      uStack_3038._4_4_ = uStack_3038._4_4_ * (uStack_2f98._4_4_ + 1.0);
      uStack_3118._0_4_ = (float)uStack_3038;
      uStack_3118._4_4_ = uStack_3038._4_4_;
      uStack_3110._0_4_ = (float)uStack_3030 * 1.0;
      uStack_3110._4_4_ = uStack_3030._4_4_ * 1.0;
      auVar130 = _local_3120;
      uStack_3108._0_4_ = (float)uStack_3028 * 1.0;
      uStack_3108._4_4_ = 0x3f800000;
      auVar28 = _local_3120;
      local_3160 = local_3120;
      uStack_3158 = uStack_3118;
      uStack_3110 = auVar130._16_8_;
      uStack_3150 = uStack_3110;
      uStack_3108 = auVar28._24_8_;
      uStack_3148 = uStack_3108;
      local_2f64 = 0x3f800000;
      local_1220 = 0x3f800000;
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      local_1240 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auStack_1230 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      local_3180._0_4_ = local_1240._0_4_;
      local_3180._4_4_ = local_1240._4_4_;
      uStack_3178._0_4_ = local_1240._8_4_;
      uStack_3178._4_4_ = local_1240._12_4_;
      uStack_3170._0_4_ = auStack_1230._0_4_;
      uStack_3170._4_4_ = auStack_1230._4_4_;
      uStack_3168._0_4_ = auStack_1230._8_4_;
      uStack_3168._4_4_ = auStack_1230._12_4_;
      local_3320._4_4_ = local_3180._4_4_ + (float)local_3120._4_4_;
      local_3320._0_4_ = (float)local_3180 + (float)local_3120._0_4_;
      uStack_3318._0_4_ = (float)uStack_3178 + (float)uStack_3038;
      uStack_3318._4_4_ = uStack_3178._4_4_ + uStack_3038._4_4_;
      uStack_3310._0_4_ = (float)uStack_3170 + (float)uStack_3030 * 1.0;
      uStack_3310._4_4_ = uStack_3170._4_4_ + uStack_3030._4_4_ * 1.0;
      auVar130 = _local_3320;
      uStack_3308._0_4_ = (float)uStack_3168 + (float)uStack_3028 * 1.0;
      uStack_3308._4_4_ = uStack_3168._4_4_ + 1.0;
      auVar3 = _local_3320;
      local_3380 = vcmpps_avx(_local_3320,local_2ae0,2);
      local_2a00 = local_3320;
      uStack_29f8 = uStack_3318;
      uStack_3310 = auVar130._16_8_;
      uStack_29f0 = uStack_3310;
      uStack_3308 = auVar3._24_8_;
      uStack_29e8 = uStack_3308;
      local_2a20 = 0x80000000800000;
      uStack_2a18 = 0x80000000800000;
      uStack_2a10 = 0x80000000800000;
      uStack_2a08 = 0x80000000800000;
      auVar30._16_8_ = uStack_3310;
      auVar30._0_16_ = _local_3320;
      auVar30._24_8_ = uStack_3308;
      auVar29._8_8_ = 0x80000000800000;
      auVar29._0_8_ = 0x80000000800000;
      auVar29._16_8_ = 0x80000000800000;
      auVar29._24_8_ = 0x80000000800000;
      auVar3 = vmaxps_avx(auVar29,auVar30);
      local_3320 = auVar3._0_8_;
      local_2920 = local_3320;
      uStack_3318 = auVar3._8_8_;
      uStack_2918 = uStack_3318;
      uStack_3310 = auVar3._16_8_;
      uStack_2910 = uStack_3310;
      uStack_3308 = auVar3._24_8_;
      uStack_2908 = uStack_3308;
      local_2940 = local_3320;
      uStack_2938 = uStack_3318;
      uStack_2930 = uStack_3310;
      uStack_2928 = uStack_3308;
      local_2944 = 0x17;
      local_29c0 = local_3320;
      uStack_29b8 = uStack_3318;
      uStack_29b0 = uStack_3310;
      uStack_29a8 = uStack_3308;
      local_2330 = local_3320;
      uStack_2328 = uStack_3318;
      local_2334 = 0x17;
      local_2960 = vpsrld_avx(auVar3._0_16_,ZEXT416(0x17));
      local_2350 = uStack_3310;
      uStack_2348 = uStack_3308;
      local_2354 = 0x17;
      local_2970 = vpsrld_avx(auVar3._16_16_,ZEXT416(0x17));
      local_29e0 = local_2960._0_8_;
      uStack_29d8 = local_2960._8_8_;
      uStack_29d0 = local_2970._0_8_;
      uStack_29c8 = local_2970._8_8_;
      local_29a0 = local_2960._0_8_;
      uStack_2998 = local_2960._8_8_;
      uStack_2990 = local_2970._0_8_;
      uStack_2988 = local_2970._8_8_;
      local_27e0 = local_3320;
      uStack_27d8 = uStack_3318;
      uStack_27d0 = uStack_3310;
      uStack_27c8 = uStack_3308;
      local_2800 = 0x807fffff807fffff;
      uStack_27f8 = 0x807fffff807fffff;
      uStack_27f0 = 0x807fffff807fffff;
      uStack_27e8 = 0x807fffff807fffff;
      auVar34._8_8_ = 0x807fffff807fffff;
      auVar34._0_8_ = 0x807fffff807fffff;
      auVar34._16_8_ = 0x807fffff807fffff;
      auVar34._24_8_ = 0x807fffff807fffff;
      auVar3 = vandps_avx(auVar34,auVar3);
      local_3320 = auVar3._0_8_;
      local_2760 = local_3320;
      uStack_3318 = auVar3._8_8_;
      uStack_2758 = uStack_3318;
      uStack_3310 = auVar3._16_8_;
      uStack_2750 = uStack_3310;
      uStack_3308 = auVar3._24_8_;
      uStack_2748 = uStack_3308;
      local_2780 = 0x3f0000003f000000;
      uStack_2778 = 0x3f0000003f000000;
      uStack_2770 = 0x3f0000003f000000;
      uStack_2768 = 0x3f0000003f000000;
      auVar35._8_8_ = 0x3f0000003f000000;
      auVar35._0_8_ = 0x3f0000003f000000;
      auVar35._16_8_ = 0x3f0000003f000000;
      auVar35._24_8_ = 0x3f0000003f000000;
      auVar2 = vorps_avx(auVar35,auVar3);
      local_2660 = local_2960._0_8_;
      uStack_2658 = local_2960._8_8_;
      uStack_2650 = local_2970._0_8_;
      uStack_2648 = local_2970._8_8_;
      local_2700 = local_2960._0_8_;
      uStack_26f8 = local_2960._8_8_;
      uStack_26f0 = local_2970._0_8_;
      uStack_26e8 = local_2970._8_8_;
      local_2720 = 0x7f0000007f;
      uStack_2718 = 0x7f0000007f;
      uStack_2710 = 0x7f0000007f;
      uStack_2708 = 0x7f0000007f;
      local_26b0 = 0x7f0000007f;
      uStack_26a8 = 0x7f0000007f;
      local_26c0 = 0x7f0000007f;
      uStack_26b8 = 0x7f0000007f;
      local_22f0 = local_2960._0_8_;
      uStack_22e8 = local_2960._8_8_;
      local_2300 = 0x7f0000007f;
      uStack_22f8 = 0x7f0000007f;
      auVar6._8_8_ = 0x7f0000007f;
      auVar6._0_8_ = 0x7f0000007f;
      local_2690 = vpsubd_avx(local_2960,auVar6);
      local_2310 = local_2970._0_8_;
      uStack_2308 = local_2970._8_8_;
      local_2320 = 0x7f0000007f;
      uStack_2318 = 0x7f0000007f;
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      local_26a0 = vpsubd_avx(local_2970,auVar5);
      local_2740 = local_2690._0_8_;
      uStack_2738 = local_2690._8_8_;
      uStack_2730 = local_26a0._0_8_;
      uStack_2728 = local_26a0._8_8_;
      local_26e0 = local_2690._0_8_;
      uStack_26d8 = local_2690._8_8_;
      uStack_26d0 = local_26a0._0_8_;
      uStack_26c8 = local_26a0._8_8_;
      local_3340 = local_2690._0_8_;
      uStack_3338 = local_2690._8_8_;
      uStack_3330 = local_26a0._0_8_;
      uStack_3328 = local_26a0._8_8_;
      local_2640 = local_2690._0_8_;
      uStack_2638 = local_2690._8_8_;
      uStack_2630 = local_26a0._0_8_;
      uStack_2628 = local_26a0._8_8_;
      auVar36._16_8_ = local_26a0._0_8_;
      auVar36._0_16_ = local_2690;
      auVar36._24_8_ = local_26a0._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar36);
      local_33a0 = auVar3._0_8_;
      uVar9 = local_33a0;
      uStack_3398 = auVar3._8_8_;
      uVar10 = uStack_3398;
      uStack_3390 = auVar3._16_8_;
      uVar11 = uStack_3390;
      uStack_3388 = auVar3._24_8_;
      uVar12 = uStack_3388;
      local_31c0 = 0x3f8000003f800000;
      uStack_31b8 = 0x3f8000003f800000;
      uStack_31b0 = 0x3f8000003f800000;
      uStack_31a8 = 0x3f8000003f800000;
      local_31a0._0_4_ = auVar3._0_4_;
      local_31a0._4_4_ = auVar3._4_4_;
      uStack_3198._0_4_ = auVar3._8_4_;
      uStack_3198._4_4_ = auVar3._12_4_;
      uStack_3190._0_4_ = auVar3._16_4_;
      uStack_3190._4_4_ = auVar3._20_4_;
      uStack_3188._0_4_ = auVar3._24_4_;
      uStack_3188._4_4_ = auVar3._28_4_;
      local_33a0._4_4_ = local_31a0._4_4_ + 1.0;
      local_33a0._0_4_ = (float)local_31a0 + 1.0;
      uStack_3398._0_4_ = (float)uStack_3198 + 1.0;
      uStack_3398._4_4_ = uStack_3198._4_4_ + 1.0;
      uStack_3390._0_4_ = (float)uStack_3190 + 1.0;
      uStack_3390._4_4_ = uStack_3190._4_4_ + 1.0;
      auVar130 = _local_33a0;
      uStack_3388._0_4_ = (float)uStack_3188 + 1.0;
      uStack_3388._4_4_ = uStack_3188._4_4_ + 1.0;
      auVar4 = _local_33a0;
      local_33c0 = vcmpps_avx(auVar2,_DAT_01f8f720,1);
      local_3320 = auVar2._0_8_;
      local_2820 = local_3320;
      uStack_3318 = auVar2._8_8_;
      uStack_2818 = uStack_3318;
      uStack_3310 = auVar2._16_8_;
      uStack_2810 = uStack_3310;
      uStack_3308 = auVar2._24_8_;
      uStack_2808 = uStack_3308;
      local_2840 = local_33c0._0_8_;
      uStack_2838 = local_33c0._8_8_;
      uStack_2830 = local_33c0._16_8_;
      uStack_2828 = local_33c0._24_8_;
      local_33e0 = vandps_avx(local_33c0,auVar2);
      local_2b40 = local_3320;
      uStack_2b38 = uStack_3318;
      uStack_2b30 = uStack_3310;
      uStack_2b28 = uStack_3308;
      local_2b60 = 0x3f8000003f800000;
      uStack_2b58 = 0x3f8000003f800000;
      uStack_2b50 = 0x3f8000003f800000;
      uStack_2b48 = 0x3f8000003f800000;
      auVar135._8_8_ = 0x3f8000003f800000;
      auVar135._0_8_ = 0x3f8000003f800000;
      auVar135._16_8_ = 0x3f8000003f800000;
      auVar135._24_8_ = 0x3f8000003f800000;
      auVar3 = vsubps_avx(auVar2,auVar135);
      local_2b80 = local_33a0;
      uStack_2b78 = uStack_3398;
      uStack_3390 = auVar130._16_8_;
      uStack_2b70 = uStack_3390;
      uStack_3388 = auVar4._24_8_;
      uStack_2b68 = uStack_3388;
      local_2860 = 0x3f8000003f800000;
      uStack_2858 = 0x3f8000003f800000;
      uStack_2850 = 0x3f8000003f800000;
      uStack_2848 = 0x3f8000003f800000;
      local_2880 = local_33c0._0_8_;
      uStack_2878 = local_33c0._8_8_;
      uStack_2870 = local_33c0._16_8_;
      uStack_2868 = local_33c0._24_8_;
      auVar33._8_8_ = 0x3f8000003f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._16_8_ = 0x3f8000003f800000;
      auVar33._24_8_ = 0x3f8000003f800000;
      local_2ba0 = vandps_avx(local_33c0,auVar33);
      auVar26._16_8_ = uStack_3390;
      auVar26._0_16_ = _local_33a0;
      auVar26._24_8_ = uStack_3388;
      _local_33a0 = vsubps_avx(auVar26,local_2ba0);
      local_3320 = auVar3._0_8_;
      uVar13 = local_3320;
      uStack_3318 = auVar3._8_8_;
      uVar14 = uStack_3318;
      uStack_3310 = auVar3._16_8_;
      uVar15 = uStack_3310;
      uStack_3308 = auVar3._24_8_;
      uVar16 = uStack_3308;
      local_31e0._0_4_ = auVar3._0_4_;
      local_31e0._4_4_ = auVar3._4_4_;
      uStack_31d8._0_4_ = auVar3._8_4_;
      uStack_31d8._4_4_ = auVar3._12_4_;
      uStack_31d0._0_4_ = auVar3._16_4_;
      uStack_31d0._4_4_ = auVar3._20_4_;
      uStack_31c8._0_4_ = auVar3._24_4_;
      uStack_31c8._4_4_ = auVar3._28_4_;
      local_3200._0_4_ = local_33e0._0_4_;
      local_3200._4_4_ = local_33e0._4_4_;
      uStack_31f8._0_4_ = local_33e0._8_4_;
      uStack_31f8._4_4_ = local_33e0._12_4_;
      uStack_31f0._0_4_ = local_33e0._16_4_;
      uStack_31f0._4_4_ = local_33e0._20_4_;
      uStack_31e8._0_4_ = local_33e0._24_4_;
      uStack_31e8._4_4_ = local_33e0._28_4_;
      local_3320._0_4_ = (float)local_3200 + (float)local_31e0;
      local_3320._4_4_ = local_3200._4_4_ + local_31e0._4_4_;
      uStack_31f8._0_4_ = (float)uStack_31f8 + (float)uStack_31d8;
      uStack_31f8._4_4_ = uStack_31f8._4_4_ + uStack_31d8._4_4_;
      uStack_31f0._0_4_ = (float)uStack_31f0 + (float)uStack_31d0;
      uStack_31f0._4_4_ = uStack_31f0._4_4_ + uStack_31d0._4_4_;
      uStack_31e8._0_4_ = (float)uStack_31e8 + (float)uStack_31c8;
      fStack_33e4 = uStack_31e8._4_4_ + uStack_31c8._4_4_;
      uStack_3318._0_4_ = (float)uStack_31f8;
      uStack_3318._4_4_ = uStack_31f8._4_4_;
      uStack_3310._0_4_ = (float)uStack_31f0;
      uStack_3310._4_4_ = uStack_31f0._4_4_;
      auVar130 = _local_3320;
      uStack_3308._0_4_ = (float)uStack_31e8;
      uStack_3308._4_4_ = fStack_33e4;
      auVar3 = _local_3320;
      local_3280 = local_3320;
      uStack_3278 = uStack_3318;
      uStack_3310 = auVar130._16_8_;
      uStack_3270 = uStack_3310;
      uStack_3308 = auVar3._24_8_;
      uStack_3268 = uStack_3308;
      local_3400 = (float)local_3320._0_4_ * (float)local_3320._0_4_;
      fStack_33fc = (float)local_3320._4_4_ * (float)local_3320._4_4_;
      fStack_33f8 = (float)uStack_31f8 * (float)uStack_31f8;
      fStack_33f4 = uStack_31f8._4_4_ * uStack_31f8._4_4_;
      fStack_33f0 = (float)uStack_31f0 * (float)uStack_31f0;
      fStack_33ec = uStack_31f0._4_4_ * uStack_31f0._4_4_;
      fStack_33e8 = (float)uStack_31e8 * (float)uStack_31e8;
      uStack_3418 = 0x3d9021bb3d9021bb;
      local_3420 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_3410 = 0x3d9021bb3d9021bb;
      uStack_3408 = 0x3d9021bb3d9021bb;
      local_24a8 = local_3420;
      local_24c0 = local_3320;
      local_23e8 = ::_ps256_cephes_log_p1;
      local_22a0 = 0x3d9021bb3d9021bb;
      uStack_2298 = 0x3d9021bb3d9021bb;
      uStack_2290 = 0x3d9021bb3d9021bb;
      uStack_2288 = 0x3d9021bb3d9021bb;
      local_22c0 = local_3320;
      uStack_22b8 = uStack_3318;
      uStack_22b0 = uStack_3310;
      uStack_22a8 = uStack_3308;
      local_22e0[0] = -0.1151461;
      local_22e0[1] = -0.1151461;
      afStack_22d8[0] = -0.1151461;
      afStack_22d8[1] = -0.1151461;
      afStack_22d0[0] = -0.1151461;
      afStack_22d0[1] = -0.1151461;
      afStack_22c8[0] = -0.1151461;
      afStack_22c8[1] = -0.1151461;
      auVar37._8_4_ = -0.1151461;
      auVar37._12_4_ = -0.1151461;
      auVar37._0_4_ = -0.1151461;
      auVar37._4_4_ = -0.1151461;
      auVar37._16_4_ = -0.1151461;
      auVar37._20_4_ = -0.1151461;
      auVar37._24_4_ = -0.1151461;
      auVar37._28_4_ = -0.1151461;
      auVar5 = vfmadd213ps_fma(auVar3,_local_3420,auVar37);
      local_2400 = ::_ps256_cephes_log_p2;
      local_3420 = auVar5._0_8_;
      local_2240 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_2238 = uStack_3418;
      uStack_2230 = 0;
      uStack_2228 = 0;
      local_2260 = local_3320;
      uStack_2258 = uStack_3318;
      uStack_2250 = uStack_3310;
      uStack_2248 = uStack_3308;
      local_2280[0] = 0.116769984;
      local_2280[1] = 0.116769984;
      afStack_2278[0] = 0.116769984;
      afStack_2278[1] = 0.116769984;
      afStack_2270[0] = 0.116769984;
      afStack_2270[1] = 0.116769984;
      afStack_2268[0] = 0.116769984;
      afStack_2268[1] = 0.116769984;
      auVar38._8_4_ = 0.116769984;
      auVar38._12_4_ = 0.116769984;
      auVar38._0_4_ = 0.116769984;
      auVar38._4_4_ = 0.116769984;
      auVar38._16_4_ = 0.116769984;
      auVar38._20_4_ = 0.116769984;
      auVar38._24_4_ = 0.116769984;
      auVar38._28_4_ = 0.116769984;
      auVar5 = vfmadd213ps_fma(auVar3,ZEXT1632(auVar5),auVar38);
      local_2418 = ::_ps256_cephes_log_p3;
      local_3420 = auVar5._0_8_;
      local_21e0 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_21d8 = uStack_3418;
      uStack_21d0 = 0;
      uStack_21c8 = 0;
      local_2200 = local_3320;
      uStack_21f8 = uStack_3318;
      uStack_21f0 = uStack_3310;
      uStack_21e8 = uStack_3308;
      local_2220[0] = -0.12420141;
      local_2220[1] = -0.12420141;
      afStack_2218[0] = -0.12420141;
      afStack_2218[1] = -0.12420141;
      afStack_2210[0] = -0.12420141;
      afStack_2210[1] = -0.12420141;
      afStack_2208[0] = -0.12420141;
      afStack_2208[1] = -0.12420141;
      auVar39._8_4_ = -0.12420141;
      auVar39._12_4_ = -0.12420141;
      auVar39._0_4_ = -0.12420141;
      auVar39._4_4_ = -0.12420141;
      auVar39._16_4_ = -0.12420141;
      auVar39._20_4_ = -0.12420141;
      auVar39._24_4_ = -0.12420141;
      auVar39._28_4_ = -0.12420141;
      auVar5 = vfmadd213ps_fma(auVar3,ZEXT1632(auVar5),auVar39);
      local_2430 = ::_ps256_cephes_log_p4;
      local_3420 = auVar5._0_8_;
      local_2180 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_2178 = uStack_3418;
      uStack_2170 = 0;
      uStack_2168 = 0;
      local_21a0 = local_3320;
      uStack_2198 = uStack_3318;
      uStack_2190 = uStack_3310;
      uStack_2188 = uStack_3308;
      local_21c0[0] = 0.14249323;
      local_21c0[1] = 0.14249323;
      afStack_21b8[0] = 0.14249323;
      afStack_21b8[1] = 0.14249323;
      afStack_21b0[0] = 0.14249323;
      afStack_21b0[1] = 0.14249323;
      afStack_21a8[0] = 0.14249323;
      afStack_21a8[1] = 0.14249323;
      auVar40._8_4_ = 0.14249323;
      auVar40._12_4_ = 0.14249323;
      auVar40._0_4_ = 0.14249323;
      auVar40._4_4_ = 0.14249323;
      auVar40._16_4_ = 0.14249323;
      auVar40._20_4_ = 0.14249323;
      auVar40._24_4_ = 0.14249323;
      auVar40._28_4_ = 0.14249323;
      auVar5 = vfmadd213ps_fma(auVar3,ZEXT1632(auVar5),auVar40);
      local_2448 = ::_ps256_cephes_log_p5;
      local_3420 = auVar5._0_8_;
      local_2120 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_2118 = uStack_3418;
      uStack_2110 = 0;
      uStack_2108 = 0;
      local_2140 = local_3320;
      uStack_2138 = uStack_3318;
      uStack_2130 = uStack_3310;
      uStack_2128 = uStack_3308;
      local_2160[0] = -0.16668057;
      local_2160[1] = -0.16668057;
      afStack_2158[0] = -0.16668057;
      afStack_2158[1] = -0.16668057;
      afStack_2150[0] = -0.16668057;
      afStack_2150[1] = -0.16668057;
      afStack_2148[0] = -0.16668057;
      afStack_2148[1] = -0.16668057;
      auVar41._8_4_ = -0.16668057;
      auVar41._12_4_ = -0.16668057;
      auVar41._0_4_ = -0.16668057;
      auVar41._4_4_ = -0.16668057;
      auVar41._16_4_ = -0.16668057;
      auVar41._20_4_ = -0.16668057;
      auVar41._24_4_ = -0.16668057;
      auVar41._28_4_ = -0.16668057;
      auVar5 = vfmadd213ps_fma(auVar3,ZEXT1632(auVar5),auVar41);
      local_2460 = ::_ps256_cephes_log_p6;
      local_3420 = auVar5._0_8_;
      local_20c0 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_20b8 = uStack_3418;
      uStack_20b0 = 0;
      uStack_20a8 = 0;
      local_20e0 = local_3320;
      uStack_20d8 = uStack_3318;
      uStack_20d0 = uStack_3310;
      uStack_20c8 = uStack_3308;
      local_2100[0] = 0.20000714;
      local_2100[1] = 0.20000714;
      afStack_20f8[0] = 0.20000714;
      afStack_20f8[1] = 0.20000714;
      afStack_20f0[0] = 0.20000714;
      afStack_20f0[1] = 0.20000714;
      afStack_20e8[0] = 0.20000714;
      afStack_20e8[1] = 0.20000714;
      auVar42._8_4_ = 0.20000714;
      auVar42._12_4_ = 0.20000714;
      auVar42._0_4_ = 0.20000714;
      auVar42._4_4_ = 0.20000714;
      auVar42._16_4_ = 0.20000714;
      auVar42._20_4_ = 0.20000714;
      auVar42._24_4_ = 0.20000714;
      auVar42._28_4_ = 0.20000714;
      auVar5 = vfmadd213ps_fma(auVar3,ZEXT1632(auVar5),auVar42);
      local_2478 = ::_ps256_cephes_log_p7;
      local_3420 = auVar5._0_8_;
      local_2060 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_2058 = uStack_3418;
      uStack_2050 = 0;
      uStack_2048 = 0;
      local_2080 = local_3320;
      uStack_2078 = uStack_3318;
      uStack_2070 = uStack_3310;
      uStack_2068 = uStack_3308;
      local_20a0[0] = -0.24999994;
      local_20a0[1] = -0.24999994;
      afStack_2098[0] = -0.24999994;
      afStack_2098[1] = -0.24999994;
      afStack_2090[0] = -0.24999994;
      afStack_2090[1] = -0.24999994;
      afStack_2088[0] = -0.24999994;
      afStack_2088[1] = -0.24999994;
      auVar43._8_4_ = -0.24999994;
      auVar43._12_4_ = -0.24999994;
      auVar43._0_4_ = -0.24999994;
      auVar43._4_4_ = -0.24999994;
      auVar43._16_4_ = -0.24999994;
      auVar43._20_4_ = -0.24999994;
      auVar43._24_4_ = -0.24999994;
      auVar43._28_4_ = -0.24999994;
      auVar5 = vfmadd213ps_fma(auVar3,ZEXT1632(auVar5),auVar43);
      local_2490 = ::_ps256_cephes_log_p8;
      local_3420 = auVar5._0_8_;
      local_2000 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_1ff8 = uStack_3418;
      uStack_1ff0 = 0;
      uStack_1fe8 = 0;
      local_2020 = local_3320;
      uStack_2018 = uStack_3318;
      uStack_2010 = uStack_3310;
      uStack_2008 = uStack_3308;
      local_2040[0] = 0.3333333;
      local_2040[1] = 0.3333333;
      afStack_2038[0] = 0.3333333;
      afStack_2038[1] = 0.3333333;
      afStack_2030[0] = 0.3333333;
      afStack_2030[1] = 0.3333333;
      afStack_2028[0] = 0.3333333;
      afStack_2028[1] = 0.3333333;
      auVar44._8_4_ = 0.3333333;
      auVar44._12_4_ = 0.3333333;
      auVar44._0_4_ = 0.3333333;
      auVar44._4_4_ = 0.3333333;
      auVar44._16_4_ = 0.3333333;
      auVar44._20_4_ = 0.3333333;
      auVar44._24_4_ = 0.3333333;
      auVar44._28_4_ = 0.3333333;
      auVar5 = vfmadd213ps_fma(auVar3,ZEXT1632(auVar5),auVar44);
      local_3420 = auVar5._0_8_;
      uVar17 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uVar18 = uStack_3418;
      uStack_3290 = 0;
      uStack_3288 = 0;
      local_32c0 = local_3320;
      uStack_32b8 = uStack_3318;
      uStack_32b0 = uStack_3310;
      uStack_32a8 = uStack_3308;
      local_32a0._0_4_ = auVar5._0_4_;
      local_32a0._4_4_ = auVar5._4_4_;
      uStack_3298._0_4_ = auVar5._8_4_;
      uStack_3298._4_4_ = auVar5._12_4_;
      local_3420._4_4_ = (float)local_3320._4_4_ * local_32a0._4_4_;
      local_3420._0_4_ = (float)local_3320._0_4_ * (float)local_32a0;
      uStack_3418._0_4_ = (float)uStack_31f8 * (float)uStack_3298;
      uStack_3418._4_4_ = uStack_31f8._4_4_ * uStack_3298._4_4_;
      uStack_3410._0_4_ = (float)uStack_31f0 * 0.0;
      uStack_3410._4_4_ = uStack_31f0._4_4_ * 0.0;
      auVar130 = _local_3420;
      local_32e0 = local_3420;
      uStack_32d8 = uStack_3418;
      uStack_3410 = auVar130._16_8_;
      uStack_32d0 = uStack_3410;
      uStack_3408 = (ulong)(uint)((float)uStack_31e8 * 0.0);
      uStack_32c8 = uStack_3408;
      local_3300 = CONCAT44(fStack_33fc,local_3400);
      uStack_32f8 = CONCAT44(fStack_33f4,fStack_33f8);
      uStack_32f0 = CONCAT44(fStack_33ec,fStack_33f0);
      uStack_32e8 = CONCAT44(fStack_33e4,fStack_33e8);
      uStack_3408._0_4_ = fStack_33e8 * (float)uStack_31e8 * 0.0;
      local_3420._4_4_ = fStack_33fc * (float)local_3320._4_4_ * local_32a0._4_4_;
      local_3420._0_4_ = local_3400 * (float)local_3320._0_4_ * (float)local_32a0;
      uStack_3418._0_4_ = fStack_33f8 * (float)uStack_31f8 * (float)uStack_3298;
      uStack_3418._4_4_ = fStack_33f4 * uStack_31f8._4_4_ * uStack_3298._4_4_;
      uStack_3410._0_4_ = fStack_33f0 * (float)uStack_31f0 * 0.0;
      uStack_3410._4_4_ = fStack_33ec * uStack_31f0._4_4_ * 0.0;
      auVar130 = _local_3420;
      uStack_3408._4_4_ = 0;
      auVar3 = _local_3420;
      local_24b0 = local_33a0;
      local_24a0 = ::_ps256_cephes_log_q1;
      local_1fa0 = local_33a0;
      uStack_1f98 = uStack_3398;
      uStack_1f90 = uStack_3390;
      uStack_1f88 = uStack_3388;
      local_1fc0[0] = -0.00021219444;
      local_1fc0[1] = -0.00021219444;
      afStack_1fb8[0] = -0.00021219444;
      afStack_1fb8[1] = -0.00021219444;
      afStack_1fb0[0] = -0.00021219444;
      afStack_1fb0[1] = -0.00021219444;
      afStack_1fa8[0] = -0.00021219444;
      afStack_1fa8[1] = -0.00021219444;
      local_1fe0 = local_3420;
      uStack_1fd8 = uStack_3418;
      uStack_3410 = auVar130._16_8_;
      uStack_1fd0 = uStack_3410;
      uStack_3408 = (ulong)(uint)(float)uStack_3408;
      uStack_1fc8 = uStack_3408;
      auVar45._8_4_ = -0.00021219444;
      auVar45._12_4_ = -0.00021219444;
      auVar45._0_4_ = -0.00021219444;
      auVar45._4_4_ = -0.00021219444;
      auVar45._16_4_ = -0.00021219444;
      auVar45._20_4_ = -0.00021219444;
      auVar45._24_4_ = -0.00021219444;
      auVar45._28_4_ = -0.00021219444;
      auVar5 = vfmadd213ps_fma(auVar45,_local_33a0,auVar3);
      local_2360 = &local_3400;
      local_2368 = ::_ps256_0p5;
      local_19a0 = CONCAT44(fStack_33fc,local_3400);
      uStack_1998 = CONCAT44(fStack_33f4,fStack_33f8);
      uStack_1990 = CONCAT44(fStack_33ec,fStack_33f0);
      uStack_1988 = CONCAT44(fStack_33e4,fStack_33e8);
      auVar128._4_4_ = fStack_33fc;
      auVar128._0_4_ = local_3400;
      auVar128._8_4_ = fStack_33f8;
      auVar128._12_4_ = fStack_33f4;
      auVar128._16_4_ = fStack_33f0;
      auVar128._20_4_ = fStack_33ec;
      auVar128._24_4_ = fStack_33e8;
      auVar128._28_4_ = fStack_33e4;
      local_19c0[0] = 0.5;
      local_19c0[1] = 0.5;
      afStack_19b8[0] = 0.5;
      afStack_19b8[1] = 0.5;
      afStack_19b0[0] = 0.5;
      afStack_19b0[1] = 0.5;
      afStack_19a8[0] = 0.5;
      afStack_19a8[1] = 0.5;
      local_3420 = auVar5._0_8_;
      local_19e0 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uStack_19d8 = uStack_3418;
      uStack_19d0 = 0;
      uStack_19c8 = 0;
      auVar60._8_4_ = 0.5;
      auVar60._12_4_ = 0.5;
      auVar60._0_4_ = 0.5;
      auVar60._4_4_ = 0.5;
      auVar60._16_4_ = 0.5;
      auVar60._20_4_ = 0.5;
      auVar60._24_4_ = 0.5;
      auVar60._28_4_ = 0.5;
      auVar5 = vfnmadd213ps_fma(auVar60,auVar128,ZEXT1632(auVar5));
      local_3220 = local_3320;
      uStack_3218 = uStack_3318;
      uStack_3210 = uStack_3310;
      uStack_3208 = uStack_3308;
      local_3420 = auVar5._0_8_;
      uVar19 = local_3420;
      uStack_3418 = auVar5._8_8_;
      uVar20 = uStack_3418;
      uStack_3230 = 0;
      uStack_3228 = 0;
      local_3240._0_4_ = auVar5._0_4_;
      local_3240._4_4_ = auVar5._4_4_;
      uStack_3238._0_4_ = auVar5._8_4_;
      uStack_3238._4_4_ = auVar5._12_4_;
      local_3320._4_4_ = local_3240._4_4_ + (float)local_3320._4_4_;
      local_3320._0_4_ = (float)local_3240 + (float)local_3320._0_4_;
      uStack_3318._0_4_ = (float)uStack_3238 + (float)uStack_31f8;
      uStack_3318._4_4_ = uStack_3238._4_4_ + uStack_31f8._4_4_;
      uStack_3310._0_4_ = (float)uStack_31f0 + 0.0;
      uStack_3310._4_4_ = uStack_31f0._4_4_ + 0.0;
      auVar130 = _local_3320;
      uStack_3308._0_4_ = (float)uStack_31e8 + 0.0;
      uStack_3308._4_4_ = fStack_33e4 + 0.0;
      auVar3 = _local_3320;
      local_24b8 = ::_ps256_cephes_log_q2;
      local_1f40 = local_33a0;
      uStack_1f38 = uStack_3398;
      uStack_1f30 = uStack_3390;
      uStack_1f28 = uStack_3388;
      local_1f60[0] = 0.6933594;
      local_1f60[1] = 0.6933594;
      afStack_1f58[0] = 0.6933594;
      afStack_1f58[1] = 0.6933594;
      afStack_1f50[0] = 0.6933594;
      afStack_1f50[1] = 0.6933594;
      afStack_1f48[0] = 0.6933594;
      afStack_1f48[1] = 0.6933594;
      local_1f80 = local_3320;
      uStack_1f78 = uStack_3318;
      uStack_3310 = auVar130._16_8_;
      uStack_1f70 = uStack_3310;
      uStack_3308 = auVar3._24_8_;
      uStack_1f68 = uStack_3308;
      auVar46._8_4_ = 0.6933594;
      auVar46._12_4_ = 0.6933594;
      auVar46._0_4_ = 0.6933594;
      auVar46._4_4_ = 0.6933594;
      auVar46._16_4_ = 0.6933594;
      auVar46._20_4_ = 0.6933594;
      auVar46._24_4_ = 0.6933594;
      auVar46._28_4_ = 0.6933594;
      auVar6 = vfmadd213ps_fma(auVar46,_local_33a0,auVar3);
      local_3320 = auVar6._0_8_;
      local_27a0 = local_3320;
      uStack_3318 = auVar6._8_8_;
      uStack_2798 = uStack_3318;
      uStack_2790 = 0;
      uStack_2788 = 0;
      local_27c0 = local_3380._0_8_;
      uStack_27b8 = local_3380._8_8_;
      uStack_27b0 = local_3380._16_8_;
      uStack_27a8 = local_3380._24_8_;
      _local_3420 = vorps_avx(local_3380,ZEXT1632(auVar6));
      local_3480 = local_3420;
      uStack_3478 = uStack_3418;
      uStack_3470 = uStack_3410;
      uStack_3468 = uStack_3408;
      local_2f68 = 0x3f800000;
      local_11e0 = 0x3f800000;
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      local_1200 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auStack_11f0 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      local_34a0 = local_1200._0_8_;
      uStack_3498 = local_1200._8_8_;
      uStack_3490 = auStack_11f0._0_8_;
      uStack_3488 = auStack_11f0._8_8_;
      local_2f6c = 0x40000000;
      local_1190 = 0x40000000;
      auVar5 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x20);
      local_11c0 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x20);
      auStack_11b0 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x30);
      local_34c0 = local_11c0._0_8_;
      uStack_34b8 = local_11c0._8_8_;
      uStack_34b0 = auStack_11b0._0_8_;
      uStack_34a8 = auStack_11b0._8_8_;
      local_3440._0_4_ = local_3420._0_4_;
      local_3440._4_4_ = local_3420._4_4_;
      uStack_3438._0_4_ = local_3420._8_4_;
      uStack_3438._4_4_ = local_3420._12_4_;
      uStack_3430._0_4_ = local_3420._16_4_;
      uStack_3430._4_4_ = local_3420._20_4_;
      uStack_3428._0_4_ = local_3420._24_4_;
      uStack_3428._4_4_ = local_3420._28_4_;
      uStack_2ec4 = uStack_3428._4_4_;
      local_3460._0_4_ = local_11c0._0_4_;
      local_3460._4_4_ = local_11c0._4_4_;
      uStack_3458._0_4_ = local_11c0._8_4_;
      uStack_3458._4_4_ = local_11c0._12_4_;
      uStack_3450._0_4_ = auStack_11b0._0_4_;
      uStack_3450._4_4_ = auStack_11b0._4_4_;
      uStack_3448._0_4_ = auStack_11b0._8_4_;
      local_2ee0 = (float)local_3460 * (float)local_3440;
      fStack_2edc = local_3460._4_4_ * local_3440._4_4_;
      fStack_2ed8 = (float)uStack_3458 * (float)uStack_3438;
      fStack_2ed4 = uStack_3458._4_4_ * uStack_3438._4_4_;
      fStack_2ed0 = (float)uStack_3450 * (float)uStack_3430;
      fStack_2ecc = uStack_3450._4_4_ * uStack_3430._4_4_;
      fStack_2ec8 = (float)uStack_3448 * (float)uStack_3428;
      local_2ca4 = 0x3f800000;
      local_1260 = 0x3f800000;
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      local_1280 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auStack_1270 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      local_2f00 = local_1280._0_8_;
      uStack_2ef8 = local_1280._8_8_;
      uStack_2ef0 = auStack_1270._0_8_;
      uStack_2ee8 = auStack_1270._8_8_;
      local_2c80 = local_1280._0_8_;
      uStack_2c78 = local_1280._8_8_;
      uStack_2c70 = auStack_1270._0_8_;
      uStack_2c68 = auStack_1270._8_8_;
      local_2b20 = ZEXT1632(ZEXT816(0) << 0x40);
      local_2c00 = 0;
      uStack_2bf8 = 0;
      uStack_2bf0 = 0;
      uStack_2be8 = 0;
      local_2c20 = CONCAT44(fStack_2edc,local_2ee0);
      uStack_2c18 = CONCAT44(fStack_2ed4,fStack_2ed8);
      uStack_2c10 = CONCAT44(fStack_2ecc,fStack_2ed0);
      uStack_2c08 = CONCAT44(uStack_3428._4_4_,fStack_2ec8);
      auVar25._8_8_ = uStack_2c18;
      auVar25._0_8_ = local_2c20;
      auVar25._16_8_ = uStack_2c10;
      auVar25._24_8_ = uStack_2c08;
      auVar3 = vsubps_avx(ZEXT832(0),auVar25);
      local_2da0._0_8_ = auVar3._0_8_;
      local_17e0 = local_2da0._0_8_;
      local_2da0._8_8_ = auVar3._8_8_;
      uStack_17d8 = local_2da0._8_8_;
      local_2da0._16_8_ = auVar3._16_8_;
      uStack_17d0 = local_2da0._16_8_;
      local_2da0._24_8_ = auVar3._24_8_;
      uStack_17c8 = local_2da0._24_8_;
      auVar65._8_8_ = 0x42b0c0a542b0c0a5;
      auVar65._0_8_ = 0x42b0c0a542b0c0a5;
      auVar65._16_8_ = 0x42b0c0a542b0c0a5;
      auVar65._24_8_ = 0x42b0c0a542b0c0a5;
      auVar3 = vminps_avx(auVar3,auVar65);
      local_2da0._0_8_ = auVar3._0_8_;
      local_2a80 = local_2da0._0_8_;
      local_2da0._8_8_ = auVar3._8_8_;
      uStack_2a78 = local_2da0._8_8_;
      local_2da0._16_8_ = auVar3._16_8_;
      uStack_2a70 = local_2da0._16_8_;
      local_2da0._24_8_ = auVar3._24_8_;
      uStack_2a68 = local_2da0._24_8_;
      auVar27._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar3,auVar27);
      local_2610 = local_2da0;
      local_2578 = ::_ps256_cephes_LOG2EF;
      local_2580 = ::_ps256_0p5;
      local_2da0._0_8_ = auVar2._0_8_;
      local_1c40 = local_2da0._0_8_;
      local_2da0._8_8_ = auVar2._8_8_;
      uStack_1c38 = local_2da0._8_8_;
      local_2da0._16_8_ = auVar2._16_8_;
      uStack_1c30 = local_2da0._16_8_;
      local_2da0._24_8_ = auVar2._24_8_;
      uStack_1c28 = local_2da0._24_8_;
      local_1c60[0] = 1.442695;
      local_1c60[1] = 1.442695;
      afStack_1c58[0] = 1.442695;
      afStack_1c58[1] = 1.442695;
      afStack_1c50[0] = 1.442695;
      afStack_1c50[1] = 1.442695;
      afStack_1c48[0] = 1.442695;
      afStack_1c48[1] = 1.442695;
      local_1c80[0] = 0.5;
      local_1c80[1] = 0.5;
      afStack_1c78[0] = 0.5;
      afStack_1c78[1] = 0.5;
      afStack_1c70[0] = 0.5;
      afStack_1c70[1] = 0.5;
      afStack_1c68[0] = 0.5;
      afStack_1c68[1] = 0.5;
      auVar54._8_4_ = 1.442695;
      auVar54._12_4_ = 1.442695;
      auVar54._0_4_ = 1.442695;
      auVar54._4_4_ = 1.442695;
      auVar54._16_4_ = 1.442695;
      auVar54._20_4_ = 1.442695;
      auVar54._24_4_ = 1.442695;
      auVar54._28_4_ = 1.442695;
      auVar53._8_4_ = 0.5;
      auVar53._12_4_ = 0.5;
      auVar53._0_4_ = 0.5;
      auVar53._4_4_ = 0.5;
      auVar53._16_4_ = 0.5;
      auVar53._20_4_ = 0.5;
      auVar53._24_4_ = 0.5;
      auVar53._28_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(auVar54,auVar2,auVar53);
      auVar4 = vroundps_avx(ZEXT1632(auVar5),1);
      auVar3 = vcmpps_avx(ZEXT1632(auVar5),auVar4,1);
      local_2e40._0_8_ = auVar3._0_8_;
      local_28e0 = local_2e40._0_8_;
      local_2e40._8_8_ = auVar3._8_8_;
      uStack_28d8 = local_2e40._8_8_;
      local_2e40._16_8_ = auVar3._16_8_;
      uStack_28d0 = local_2e40._16_8_;
      local_2e40._24_8_ = auVar3._24_8_;
      uStack_28c8 = local_2e40._24_8_;
      local_2900 = 0x3f8000003f800000;
      uStack_28f8 = 0x3f8000003f800000;
      uStack_28f0 = 0x3f8000003f800000;
      uStack_28e8 = 0x3f8000003f800000;
      auVar31._8_8_ = 0x3f8000003f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._16_8_ = 0x3f8000003f800000;
      auVar31._24_8_ = 0x3f8000003f800000;
      local_2e40 = vandps_avx(auVar3,auVar31);
      local_2dc0 = auVar4._0_8_;
      local_2c40 = local_2dc0;
      uStack_2db8 = auVar4._8_8_;
      uStack_2c38 = uStack_2db8;
      uStack_2db0 = auVar4._16_8_;
      uStack_2c30 = uStack_2db0;
      uStack_2da8 = auVar4._24_8_;
      uStack_2c28 = uStack_2da8;
      local_2c60 = local_2e40._0_8_;
      uStack_2c58 = local_2e40._8_8_;
      uStack_2c50 = local_2e40._16_8_;
      uStack_2c48 = local_2e40._24_8_;
      local_2de0 = vsubps_avx(auVar4,local_2e40);
      local_23c0 = local_2de0;
      local_23b0 = ::_ps256_cephes_exp_C1;
      local_1880 = local_2de0._0_8_;
      uStack_1878 = local_2de0._8_8_;
      uStack_1870 = local_2de0._16_8_;
      uStack_1868 = local_2de0._24_8_;
      local_18a0[0] = 0.6933594;
      local_18a0[1] = 0.6933594;
      afStack_1898[0] = 0.6933594;
      afStack_1898[1] = 0.6933594;
      afStack_1890[0] = 0.6933594;
      afStack_1890[1] = 0.6933594;
      afStack_1888[0] = 0.6933594;
      afStack_1888[1] = 0.6933594;
      local_18c0 = local_2da0._0_8_;
      uStack_18b8 = local_2da0._8_8_;
      uStack_18b0 = local_2da0._16_8_;
      uStack_18a8 = local_2da0._24_8_;
      auVar63._8_4_ = 0.6933594;
      auVar63._12_4_ = 0.6933594;
      auVar63._0_4_ = 0.6933594;
      auVar63._4_4_ = 0.6933594;
      auVar63._16_4_ = 0.6933594;
      auVar63._20_4_ = 0.6933594;
      auVar63._24_4_ = 0.6933594;
      auVar63._28_4_ = 0.6933594;
      auVar5 = vfnmadd213ps_fma(auVar63,local_2de0,auVar2);
      local_23c8 = ::_ps256_cephes_exp_C2;
      local_1820 = local_2de0._0_8_;
      uStack_1818 = local_2de0._8_8_;
      uStack_1810 = local_2de0._16_8_;
      uStack_1808 = local_2de0._24_8_;
      local_1840[0] = -0.00021219444;
      local_1840[1] = -0.00021219444;
      afStack_1838[0] = -0.00021219444;
      afStack_1838[1] = -0.00021219444;
      afStack_1830[0] = -0.00021219444;
      afStack_1830[1] = -0.00021219444;
      afStack_1828[0] = -0.00021219444;
      afStack_1828[1] = -0.00021219444;
      local_2da0._0_8_ = auVar5._0_8_;
      local_1860 = local_2da0._0_8_;
      local_2da0._8_8_ = auVar5._8_8_;
      uStack_1858 = local_2da0._8_8_;
      uStack_1850 = 0;
      uStack_1848 = 0;
      auVar64._8_4_ = -0.00021219444;
      auVar64._12_4_ = -0.00021219444;
      auVar64._0_4_ = -0.00021219444;
      auVar64._4_4_ = -0.00021219444;
      auVar64._16_4_ = -0.00021219444;
      auVar64._20_4_ = -0.00021219444;
      auVar64._24_4_ = -0.00021219444;
      auVar64._28_4_ = -0.00021219444;
      auVar5 = vfnmadd213ps_fma(auVar64,local_2de0,ZEXT1632(auVar5));
      auVar135 = ZEXT1632(auVar5);
      local_2da0._0_8_ = auVar5._0_8_;
      local_2d40 = local_2da0._0_8_;
      local_2da0._8_8_ = auVar5._8_8_;
      uStack_2d38 = local_2da0._8_8_;
      uStack_2d30 = 0;
      uStack_2d28 = 0;
      local_2d20._0_4_ = auVar5._0_4_;
      local_2d20._4_4_ = auVar5._4_4_;
      uStack_2d18._0_4_ = auVar5._8_4_;
      uStack_2d18._4_4_ = auVar5._12_4_;
      local_2dc0._4_4_ = local_2d20._4_4_ * local_2d20._4_4_;
      local_2dc0._0_4_ = (float)local_2d20 * (float)local_2d20;
      local_1a20 = local_2dc0;
      uStack_2db8._0_4_ = (float)uStack_2d18 * (float)uStack_2d18;
      uStack_2db8._4_4_ = uStack_2d18._4_4_ * uStack_2d18._4_4_;
      auVar1 = _local_2dc0;
      _local_2dc0 = ZEXT1632(_local_2dc0);
      auVar26 = _local_2dc0;
      uStack_2e58 = 0x3950696739506967;
      local_2e60 = (undefined1  [8])0x3950696739506967;
      uStack_2e50 = 0x3950696739506967;
      uStack_2e48 = 0x3950696739506967;
      local_2600 = local_2e60;
      local_2598 = ::_ps256_cephes_exp_p1;
      local_1be0 = 0x3950696739506967;
      uStack_1bd8 = 0x3950696739506967;
      uStack_1bd0 = 0x3950696739506967;
      uStack_1bc8 = 0x3950696739506967;
      local_1c00 = local_2da0._0_8_;
      uStack_1bf8 = local_2da0._8_8_;
      uStack_1bf0 = 0;
      uStack_1be8 = 0;
      local_1c20[0] = 0.0013981999;
      local_1c20[1] = 0.0013981999;
      afStack_1c18[0] = 0.0013981999;
      afStack_1c18[1] = 0.0013981999;
      afStack_1c10[0] = 0.0013981999;
      afStack_1c10[1] = 0.0013981999;
      afStack_1c08[0] = 0.0013981999;
      afStack_1c08[1] = 0.0013981999;
      auVar55._8_4_ = 0.0013981999;
      auVar55._12_4_ = 0.0013981999;
      auVar55._0_4_ = 0.0013981999;
      auVar55._4_4_ = 0.0013981999;
      auVar55._16_4_ = 0.0013981999;
      auVar55._20_4_ = 0.0013981999;
      auVar55._24_4_ = 0.0013981999;
      auVar55._28_4_ = 0.0013981999;
      auVar5 = vfmadd213ps_fma(auVar135,_local_2e60,auVar55);
      local_25b0 = ::_ps256_cephes_exp_p2;
      local_2e60 = auVar5._0_8_;
      local_1b80 = local_2e60;
      uStack_2e58 = auVar5._8_8_;
      uStack_1b78 = uStack_2e58;
      uStack_1b70 = 0;
      uStack_1b68 = 0;
      local_1ba0 = local_2da0._0_8_;
      uStack_1b98 = local_2da0._8_8_;
      uStack_1b90 = 0;
      uStack_1b88 = 0;
      local_1bc0[0] = 0.008333452;
      local_1bc0[1] = 0.008333452;
      afStack_1bb8[0] = 0.008333452;
      afStack_1bb8[1] = 0.008333452;
      afStack_1bb0[0] = 0.008333452;
      afStack_1bb0[1] = 0.008333452;
      afStack_1ba8[0] = 0.008333452;
      afStack_1ba8[1] = 0.008333452;
      auVar56._8_4_ = 0.008333452;
      auVar56._12_4_ = 0.008333452;
      auVar56._0_4_ = 0.008333452;
      auVar56._4_4_ = 0.008333452;
      auVar56._16_4_ = 0.008333452;
      auVar56._20_4_ = 0.008333452;
      auVar56._24_4_ = 0.008333452;
      auVar56._28_4_ = 0.008333452;
      auVar5 = vfmadd213ps_fma(auVar135,ZEXT1632(auVar5),auVar56);
      local_25c8 = ::_ps256_cephes_exp_p3;
      local_2e60 = auVar5._0_8_;
      local_1b20 = local_2e60;
      uStack_2e58 = auVar5._8_8_;
      uStack_1b18 = uStack_2e58;
      uStack_1b10 = 0;
      uStack_1b08 = 0;
      local_1b40 = local_2da0._0_8_;
      uStack_1b38 = local_2da0._8_8_;
      uStack_1b30 = 0;
      uStack_1b28 = 0;
      local_1b60[0] = 0.041665796;
      local_1b60[1] = 0.041665796;
      afStack_1b58[0] = 0.041665796;
      afStack_1b58[1] = 0.041665796;
      afStack_1b50[0] = 0.041665796;
      afStack_1b50[1] = 0.041665796;
      afStack_1b48[0] = 0.041665796;
      afStack_1b48[1] = 0.041665796;
      auVar57._8_4_ = 0.041665796;
      auVar57._12_4_ = 0.041665796;
      auVar57._0_4_ = 0.041665796;
      auVar57._4_4_ = 0.041665796;
      auVar57._16_4_ = 0.041665796;
      auVar57._20_4_ = 0.041665796;
      auVar57._24_4_ = 0.041665796;
      auVar57._28_4_ = 0.041665796;
      auVar5 = vfmadd213ps_fma(auVar135,ZEXT1632(auVar5),auVar57);
      local_25e0 = ::_ps256_cephes_exp_p4;
      local_2e60 = auVar5._0_8_;
      local_1ac0 = local_2e60;
      uStack_2e58 = auVar5._8_8_;
      uStack_1ab8 = uStack_2e58;
      uStack_1ab0 = 0;
      uStack_1aa8 = 0;
      local_1ae0 = local_2da0._0_8_;
      uStack_1ad8 = local_2da0._8_8_;
      uStack_1ad0 = 0;
      uStack_1ac8 = 0;
      local_1b00[0] = 0.16666666;
      local_1b00[1] = 0.16666666;
      afStack_1af8[0] = 0.16666666;
      afStack_1af8[1] = 0.16666666;
      afStack_1af0[0] = 0.16666666;
      afStack_1af0[1] = 0.16666666;
      afStack_1ae8[0] = 0.16666666;
      afStack_1ae8[1] = 0.16666666;
      auVar58._8_4_ = 0.16666666;
      auVar58._12_4_ = 0.16666666;
      auVar58._0_4_ = 0.16666666;
      auVar58._4_4_ = 0.16666666;
      auVar58._16_4_ = 0.16666666;
      auVar58._20_4_ = 0.16666666;
      auVar58._24_4_ = 0.16666666;
      auVar58._28_4_ = 0.16666666;
      auVar5 = vfmadd213ps_fma(auVar135,ZEXT1632(auVar5),auVar58);
      local_25f8 = ::_ps256_cephes_exp_p5;
      local_2e60 = auVar5._0_8_;
      local_1a60 = local_2e60;
      uStack_2e58 = auVar5._8_8_;
      uStack_1a58 = uStack_2e58;
      uStack_1a50 = 0;
      uStack_1a48 = 0;
      local_1a80 = local_2da0._0_8_;
      uStack_1a78 = local_2da0._8_8_;
      uStack_1a70 = 0;
      uStack_1a68 = 0;
      local_1aa0[0] = 0.5;
      local_1aa0[1] = 0.5;
      afStack_1a98[0] = 0.5;
      afStack_1a98[1] = 0.5;
      afStack_1a90[0] = 0.5;
      afStack_1a90[1] = 0.5;
      afStack_1a88[0] = 0.5;
      afStack_1a88[1] = 0.5;
      auVar59._8_4_ = 0.5;
      auVar59._12_4_ = 0.5;
      auVar59._0_4_ = 0.5;
      auVar59._4_4_ = 0.5;
      auVar59._16_4_ = 0.5;
      auVar59._20_4_ = 0.5;
      auVar59._24_4_ = 0.5;
      auVar59._28_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(auVar135,ZEXT1632(auVar5),auVar59);
      local_2608 = local_2dc0;
      local_2e60 = auVar5._0_8_;
      local_1a00 = local_2e60;
      uStack_2e58 = auVar5._8_8_;
      uStack_19f8 = uStack_2e58;
      uStack_19f0 = 0;
      uStack_19e8 = 0;
      uStack_2db8 = auVar1._8_8_;
      uStack_1a18 = uStack_2db8;
      uStack_1a10 = 0;
      uStack_1a08 = 0;
      local_1a40 = local_2da0._0_8_;
      uStack_1a38 = local_2da0._8_8_;
      uStack_1a30 = 0;
      uStack_1a28 = 0;
      auVar5 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar5),auVar135);
      local_2e60 = auVar5._0_8_;
      uVar21 = local_2e60;
      uStack_2e58 = auVar5._8_8_;
      uVar22 = uStack_2e58;
      uStack_2cd0 = 0;
      uStack_2cc8 = 0;
      local_2d00 = 0x3f8000003f800000;
      uStack_2cf8 = 0x3f8000003f800000;
      uStack_2cf0 = 0x3f8000003f800000;
      uStack_2ce8 = 0x3f8000003f800000;
      local_2ce0._0_4_ = auVar5._0_4_;
      local_2ce0._4_4_ = auVar5._4_4_;
      uStack_2cd8._0_4_ = auVar5._8_4_;
      uStack_2cd8._4_4_ = auVar5._12_4_;
      local_2e60._4_4_ = local_2ce0._4_4_ + 1.0;
      local_2e60._0_4_ = (float)local_2ce0 + 1.0;
      uStack_2e58._0_4_ = (float)uStack_2cd8 + 1.0;
      uStack_2e58._4_4_ = uStack_2cd8._4_4_ + 1.0;
      uStack_2e50._0_4_ = 0x3f800000;
      uStack_2e50._4_4_ = 0x3f800000;
      auVar130 = _local_2e60;
      uStack_2e48._0_4_ = 0x3f800000;
      uStack_2e48._4_4_ = 0x3f800000;
      auVar3 = _local_2e60;
      local_1780._0_4_ = local_2de0._0_4_;
      local_1780._4_4_ = local_2de0._4_4_;
      uStack_1778._0_4_ = local_2de0._8_4_;
      uStack_1778._4_4_ = local_2de0._12_4_;
      uStack_1770._0_4_ = local_2de0._16_4_;
      uStack_1770._4_4_ = local_2de0._20_4_;
      uStack_1768._0_4_ = local_2de0._24_4_;
      uStack_1768._4_4_ = local_2de0._28_4_;
      local_2e00 = CONCAT44((int)local_1780._4_4_,(int)(float)local_1780);
      uStack_2df8 = CONCAT44((int)uStack_1778._4_4_,(int)(float)uStack_1778);
      uStack_2df0 = CONCAT44((int)uStack_1770._4_4_,(int)(float)uStack_1770);
      uStack_2de8 = CONCAT44((int)uStack_1768._4_4_,(int)(float)uStack_1768);
      local_1660 = local_2e00;
      uStack_1658 = uStack_2df8;
      uStack_1650 = uStack_2df0;
      uStack_1648 = uStack_2de8;
      local_1700 = local_2e00;
      uStack_16f8 = uStack_2df8;
      uStack_16f0 = uStack_2df0;
      uStack_16e8 = uStack_2de8;
      local_1720 = 0x7f0000007f;
      uStack_1718 = 0x7f0000007f;
      uStack_1710 = 0x7f0000007f;
      uStack_1708 = 0x7f0000007f;
      local_16b0 = 0x7f0000007f;
      uStack_16a8 = 0x7f0000007f;
      local_16c0 = 0x7f0000007f;
      uStack_16b8 = 0x7f0000007f;
      local_1310 = local_2e00;
      uStack_1308 = uStack_2df8;
      local_1320 = 0x7f0000007f;
      uStack_1318 = 0x7f0000007f;
      auVar73._8_8_ = uStack_2df8;
      auVar73._0_8_ = local_2e00;
      auVar72._8_8_ = 0x7f0000007f;
      auVar72._0_8_ = 0x7f0000007f;
      local_1690 = vpaddd_avx(auVar73,auVar72);
      local_1330 = uStack_2df0;
      uStack_1328 = uStack_2de8;
      local_1340 = 0x7f0000007f;
      uStack_1338 = 0x7f0000007f;
      auVar71._8_8_ = uStack_2de8;
      auVar71._0_8_ = uStack_2df0;
      auVar70._8_8_ = 0x7f0000007f;
      auVar70._0_8_ = 0x7f0000007f;
      local_16a0 = vpaddd_avx(auVar71,auVar70);
      local_1740 = local_1690._0_8_;
      uStack_1738 = local_1690._8_8_;
      uStack_1730 = local_16a0._0_8_;
      uStack_1728 = local_16a0._8_8_;
      local_16e0 = local_1690._0_8_;
      uStack_16d8 = local_1690._8_8_;
      uStack_16d0 = local_16a0._0_8_;
      uStack_16c8 = local_16a0._8_8_;
      local_14a0 = local_1690._0_8_;
      uStack_1498 = local_1690._8_8_;
      uStack_1490 = local_16a0._0_8_;
      uStack_1488 = local_16a0._8_8_;
      local_14a4 = 0x17;
      local_1520 = local_1690._0_8_;
      uStack_1518 = local_1690._8_8_;
      uStack_1510 = local_16a0._0_8_;
      uStack_1508 = local_16a0._8_8_;
      local_1290 = local_1690._0_8_;
      uStack_1288 = local_1690._8_8_;
      local_1294 = 0x17;
      local_14c0 = vpslld_avx(local_1690,ZEXT416(0x17));
      local_12b0 = local_16a0._0_8_;
      uStack_12a8 = local_16a0._8_8_;
      local_12b4 = 0x17;
      local_14d0 = vpslld_avx(local_16a0,ZEXT416(0x17));
      local_1540 = local_14c0._0_8_;
      uStack_1538 = local_14c0._8_8_;
      uStack_1530 = local_14d0._0_8_;
      uStack_1528 = local_14d0._8_8_;
      local_1500 = local_14c0._0_8_;
      uStack_14f8 = local_14c0._8_8_;
      uStack_14f0 = local_14d0._0_8_;
      uStack_14e8 = local_14d0._8_8_;
      local_2e00 = local_14c0._0_8_;
      uStack_2df8 = local_14c0._8_8_;
      uStack_2df0 = local_14d0._0_8_;
      uStack_2de8 = local_14d0._8_8_;
      local_13c0 = local_14c0._0_8_;
      uStack_13b8 = local_14c0._8_8_;
      uStack_13b0 = local_14d0._0_8_;
      uStack_13a8 = local_14d0._8_8_;
      local_2e80 = local_14c0._0_8_;
      uStack_2e78 = local_14c0._8_8_;
      uStack_2e70 = local_14d0._0_8_;
      uStack_2e68 = local_14d0._8_8_;
      local_2d60 = local_2e60;
      uStack_2d58 = uStack_2e58;
      uStack_2e50 = auVar130._16_8_;
      uStack_2d50 = uStack_2e50;
      uStack_2e48 = auVar3._24_8_;
      uStack_2d48 = uStack_2e48;
      local_2d80._0_4_ = local_14c0._0_4_;
      local_2d80._4_4_ = local_14c0._4_4_;
      uStack_2d78._0_4_ = local_14c0._8_4_;
      uStack_2d78._4_4_ = local_14c0._12_4_;
      uStack_2d70._0_4_ = local_14d0._0_4_;
      uStack_2d70._4_4_ = local_14d0._4_4_;
      uStack_2d68._0_4_ = local_14d0._8_4_;
      local_2e60._0_4_ = ((float)local_2ce0 + 1.0) * (float)local_2d80;
      local_2e60._4_4_ = (local_2ce0._4_4_ + 1.0) * local_2d80._4_4_;
      uStack_2d78._0_4_ = ((float)uStack_2cd8 + 1.0) * (float)uStack_2d78;
      uStack_2d78._4_4_ = (uStack_2cd8._4_4_ + 1.0) * uStack_2d78._4_4_;
      uStack_2e58._0_4_ = (float)uStack_2d78;
      uStack_2e58._4_4_ = uStack_2d78._4_4_;
      uStack_2e50._0_4_ = (float)uStack_2d70 * 1.0;
      uStack_2e50._4_4_ = uStack_2d70._4_4_ * 1.0;
      auVar130 = _local_2e60;
      uStack_2e48._0_4_ = (float)uStack_2d68 * 1.0;
      uStack_2e48._4_4_ = 0x3f800000;
      auVar25 = _local_2e60;
      local_2ec0 = local_2e60;
      uStack_2eb8 = uStack_2e58;
      uStack_2e50 = auVar130._16_8_;
      uStack_2eb0 = uStack_2e50;
      uStack_2e48 = auVar25._24_8_;
      uStack_2ea8 = uStack_2e48;
      local_2ea0._0_4_ = local_1280._0_4_;
      local_2ea0._4_4_ = local_1280._4_4_;
      uStack_2e98._0_4_ = local_1280._8_4_;
      uStack_2e98._4_4_ = local_1280._12_4_;
      uStack_2e90._0_4_ = auStack_1270._0_4_;
      uStack_2e90._4_4_ = auStack_1270._4_4_;
      uStack_2e88._0_4_ = auStack_1270._8_4_;
      uStack_2e88._4_4_ = auStack_1270._12_4_;
      local_2ca0 = (float)local_2ea0 + (float)local_2e60._0_4_;
      fStack_2c9c = local_2ea0._4_4_ + (float)local_2e60._4_4_;
      fStack_2c98 = (float)uStack_2e98 + (float)uStack_2d78;
      fStack_2c94 = uStack_2e98._4_4_ + uStack_2d78._4_4_;
      fStack_2c90 = (float)uStack_2e90 + (float)uStack_2d70 * 1.0;
      fStack_2c8c = uStack_2e90._4_4_ + uStack_2d70._4_4_ * 1.0;
      fStack_2c88 = (float)uStack_2e88 + (float)uStack_2d68 * 1.0;
      fStack_2c84 = uStack_2e88._4_4_ + 1.0;
      auVar24._16_8_ = auStack_1270._0_8_;
      auVar24._0_16_ = local_1280;
      auVar24._24_8_ = auStack_1270._8_8_;
      auVar4._4_4_ = fStack_2c9c;
      auVar4._0_4_ = local_2ca0;
      auVar4._8_4_ = fStack_2c98;
      auVar4._12_4_ = fStack_2c94;
      auVar4._16_4_ = fStack_2c90;
      auVar4._20_4_ = fStack_2c8c;
      auVar4._24_4_ = fStack_2c88;
      auVar4._28_4_ = fStack_2c84;
      local_2f20 = vdivps_avx(auVar24,auVar4);
      local_2f40 = local_11c0._0_8_;
      uStack_2f38 = local_11c0._8_8_;
      uStack_2f30 = auStack_11b0._0_8_;
      uStack_2f28 = auStack_11b0._8_8_;
      auVar2._16_8_ = auStack_11b0._0_8_;
      auVar2._0_16_ = local_11c0;
      auVar2._24_8_ = auStack_11b0._8_8_;
      local_2f60._0_4_ = local_1200._0_4_;
      local_2f60._4_4_ = local_1200._4_4_;
      uStack_2f58._0_4_ = local_1200._8_4_;
      uStack_2f58._4_4_ = local_1200._12_4_;
      uStack_2f50._0_4_ = auStack_11f0._0_4_;
      uStack_2f50._4_4_ = auStack_11f0._4_4_;
      uStack_2f48._0_4_ = auStack_11f0._8_4_;
      uStack_2f48._4_4_ = auStack_11f0._12_4_;
      auVar134._0_4_ = (uint)local_2f60 ^ (uint)DAT_01f8f760;
      auVar134._4_4_ = local_2f60._4_4_ ^ DAT_01f8f760._4_4_;
      auVar134._8_4_ = (uint)uStack_2f58 ^ DAT_01f8f760._8_4_;
      auVar134._12_4_ = uStack_2f58._4_4_ ^ DAT_01f8f760._12_4_;
      auVar134._16_4_ = (uint)uStack_2f50 ^ DAT_01f8f760._16_4_;
      auVar134._20_4_ = uStack_2f50._4_4_ ^ DAT_01f8f760._20_4_;
      auVar134._24_4_ = (uint)uStack_2f48 ^ DAT_01f8f760._24_4_;
      auVar134._28_4_ = uStack_2f48._4_4_ ^ DAT_01f8f760._28_4_;
      auVar5 = vfmadd213ps_fma(auVar2,local_2f20,auVar134);
      local_34e0._0_4_ = auVar126._0_4_;
      local_34e0._4_4_ = auVar126._4_4_;
      fStack_34d8 = auVar126._8_4_;
      fStack_34d4 = auVar126._12_4_;
      fStack_34d0 = auVar126._16_4_;
      fStack_34cc = auVar126._20_4_;
      fStack_34c8 = (float)uStack_3608;
      uStack_34c4 = (undefined4)((ulong)uStack_3608 >> 0x20);
      local_3500._0_4_ = auVar5._0_4_;
      local_3500._4_4_ = auVar5._4_4_;
      fStack_34f8 = auVar5._8_4_;
      fStack_34f4 = auVar5._12_4_;
      local_3720 = CONCAT44((float)local_34e0._4_4_ * (float)local_3500._4_4_,
                            (float)local_34e0._0_4_ * (float)local_3500._0_4_);
      uStack_3718 = CONCAT44(fStack_34d4 * fStack_34f4,fStack_34d8 * fStack_34f8);
      uStack_3710 = CONCAT44(fStack_34cc * 0.0,fStack_34d0 * 0.0);
      uStack_3708 = CONCAT44(uStack_34c4,fStack_34c8 * 0.0);
      local_35d0 = local_36a0;
      local_3600 = local_3720;
      uStack_35f8 = uStack_3718;
      uStack_35f0 = uStack_3710;
      uStack_35e8 = uStack_3708;
      auVar3._8_8_ = uStack_3718;
      auVar3._0_8_ = local_3720;
      auVar3._16_8_ = uStack_3710;
      auVar3._24_8_ = uStack_3708;
      *local_36a0 = auVar3;
      local_36a0 = local_36a0 + 1;
      _local_3500 = ZEXT1632(auVar5);
      _local_34e0 = auVar127;
      local_3460 = local_11c0._0_8_;
      uStack_3458 = local_11c0._8_8_;
      uStack_3450 = auStack_11b0._0_8_;
      uStack_3448 = auStack_11b0._8_8_;
      local_3440 = local_3420;
      uStack_3438 = uStack_3418;
      uStack_3430 = uStack_3410;
      uStack_3428 = uStack_3408;
      _local_3320 = ZEXT1632(auVar6);
      local_32a0 = uVar17;
      uStack_3298 = uVar18;
      local_3260 = local_3280;
      uStack_3258 = uStack_3278;
      uStack_3250 = uStack_3270;
      uStack_3248 = uStack_3268;
      local_3240 = uVar19;
      uStack_3238 = uVar20;
      local_3200 = local_33e0._0_8_;
      uStack_31f8 = local_33e0._8_8_;
      uStack_31f0 = local_33e0._16_8_;
      uStack_31e8 = local_33e0._24_8_;
      local_31e0 = uVar13;
      uStack_31d8 = uVar14;
      uStack_31d0 = uVar15;
      uStack_31c8 = uVar16;
      local_31a0 = uVar9;
      uStack_3198 = uVar10;
      uStack_3190 = uVar11;
      uStack_3188 = uVar12;
      local_3180 = local_1240._0_8_;
      uStack_3178 = local_1240._8_8_;
      uStack_3170 = auStack_1230._0_8_;
      uStack_3168 = auStack_1230._8_8_;
      _local_3120 = auVar28;
      local_30e0 = local_3360;
      uStack_30d8 = uStack_3358;
      uStack_30d0 = uStack_3350;
      uStack_30c8 = uStack_3348;
      _local_3080 = auVar32;
      local_3060 = auVar131;
      local_3040 = local_1400._0_8_;
      uStack_3038 = local_1400._8_8_;
      uStack_3030 = local_1410._0_8_;
      uStack_3028 = local_1410._8_8_;
      local_2fe0 = local_3000;
      uStack_2fd8 = uStack_2ff8;
      uStack_2fd0 = uStack_2ff0;
      uStack_2fc8 = uStack_2fe8;
      local_2fa0 = uVar7;
      uStack_2f98 = uVar8;
      local_2f60 = local_1200._0_8_;
      uStack_2f58 = local_1200._8_8_;
      uStack_2f50 = auStack_11f0._0_8_;
      uStack_2f48 = auStack_11f0._8_8_;
      local_2ea0 = local_2c80;
      uStack_2e98 = uStack_2c78;
      uStack_2e90 = uStack_2c70;
      uStack_2e88 = uStack_2c68;
      _local_2e60 = auVar25;
      local_2e20 = local_3360;
      uStack_2e18 = uStack_3358;
      uStack_2e10 = uStack_3350;
      uStack_2e08 = uStack_3348;
      _local_2dc0 = auVar26;
      local_2da0 = auVar135;
      local_2d80 = local_14c0._0_8_;
      uStack_2d78 = local_14c0._8_8_;
      uStack_2d70 = local_14d0._0_8_;
      uStack_2d68 = local_14d0._8_8_;
      local_2d20 = local_2d40;
      uStack_2d18 = uStack_2d38;
      uStack_2d10 = uStack_2d30;
      uStack_2d08 = uStack_2d28;
      local_2ce0 = uVar21;
      uStack_2cd8 = uVar22;
      local_2b00 = local_2b20;
      local_2ac0 = local_2ae0;
      local_2a60 = local_2aa0;
      uStack_2a58 = uStack_2a98;
      uStack_2a50 = uStack_2a90;
      uStack_2a48 = uStack_2a88;
      local_25f0 = local_2610;
      local_25e8 = local_2600;
      local_25d8 = local_2610;
      local_25d0 = local_2600;
      local_25c0 = local_2610;
      local_25b8 = local_2600;
      local_25a8 = local_2610;
      local_25a0 = local_2600;
      local_2590 = local_2610;
      local_2588 = local_2600;
      local_2570 = local_2610;
      local_2548 = local_2568;
      local_2540 = local_2558;
      local_2530 = local_2568;
      local_2528 = local_2558;
      local_2518 = local_2568;
      local_2510 = local_2558;
      local_2500 = local_2568;
      local_24f8 = local_2558;
      local_24e8 = local_2568;
      local_24e0 = local_2558;
      local_24c8 = local_2568;
      local_2498 = local_24b0;
      local_2488 = local_24c0;
      local_2480 = local_24a8;
      local_2470 = local_24c0;
      local_2468 = local_24a8;
      local_2458 = local_24c0;
      local_2450 = local_24a8;
      local_2440 = local_24c0;
      local_2438 = local_24a8;
      local_2428 = local_24c0;
      local_2420 = local_24a8;
      local_2410 = local_24c0;
      local_2408 = local_24a8;
      local_23f8 = local_24c0;
      local_23f0 = local_24a8;
      local_23e0 = local_24c0;
      local_23d8 = local_24a8;
      local_23d0 = local_2610;
      local_23b8 = local_2610;
      local_23a8 = local_23c0;
      local_23a0 = local_2568;
      local_2388 = local_2568;
      local_2378 = local_2390;
      local_2370 = local_24a8;
      local_17c0 = local_1800;
      uStack_17b8 = uStack_17f8;
      uStack_17b0 = uStack_17f0;
      uStack_17a8 = uStack_17e8;
      uStack_1788 = uStack_3608;
      local_1780 = local_2de0._0_8_;
      uStack_1778 = local_2de0._8_8_;
      uStack_1770 = local_2de0._16_8_;
      uStack_1768 = local_2de0._24_8_;
      local_1760 = local_30a0._0_8_;
      uStack_1758 = local_30a0._8_8_;
      uStack_1750 = local_30a0._16_8_;
      uStack_1748 = local_30a0._24_8_;
      local_1680 = local_2680;
      uStack_1678 = uStack_2678;
      uStack_1670 = uStack_2670;
      uStack_1668 = uStack_2668;
      local_1580 = local_2680;
      uStack_1578 = uStack_2678;
      uStack_1570 = uStack_2670;
      uStack_1568 = uStack_2668;
      local_125c = local_1260;
      local_1258 = local_1260;
      local_1254 = local_1260;
      local_1250 = local_1260;
      local_124c = local_1260;
      local_1248 = local_1260;
      local_1244 = local_1260;
      local_121c = local_1220;
      local_1218 = local_1220;
      local_1214 = local_1220;
      local_1210 = local_1220;
      local_120c = local_1220;
      local_1208 = local_1220;
      local_1204 = local_1220;
      local_11dc = local_11e0;
      local_11d8 = local_11e0;
      local_11d4 = local_11e0;
      local_11d0 = local_11e0;
      local_11cc = local_11e0;
      local_11c8 = local_11e0;
      local_11c4 = local_11e0;
      local_118c = local_1190;
      local_1188 = local_1190;
      local_1184 = local_1190;
      local_1180 = local_1190;
      local_117c = local_1190;
      local_1178 = local_1190;
      local_1174 = local_1190;
    }
    for (; local_3530 = local_3638, local_36c8 = local_3590, local_36f8 + 3 < local_3690;
        local_36f8 = local_36f8 + 4) {
      local_35c8 = local_36a0;
      local_35c0 = *(undefined8 *)*local_36a0;
      uStack_35b8 = *(undefined8 *)(*local_36a0 + 8);
      auVar67 = *(undefined1 (*) [16])*local_36a0;
      local_ab0 = 0;
      uStack_aa8 = 0;
      local_1080 = 0x3f8000003f800000;
      uStack_1078 = 0x3f8000003f800000;
      local_130 = 0x42b0c0a542b0c0a5;
      uStack_128 = 0x42b0c0a542b0c0a5;
      auVar123._8_8_ = 0x42b0c0a542b0c0a5;
      auVar123._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(*(undefined1 (*) [16])*local_36a0,auVar123);
      local_ec0._0_8_ = auVar5._0_8_;
      local_a40 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar5._8_8_;
      uStack_a38 = local_ec0._8_8_;
      local_a70 = 0xc2b0c0a5c2b0c0a5;
      uStack_a68 = 0xc2b0c0a5c2b0c0a5;
      auVar86._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar86._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar1 = vmaxps_avx(auVar5,auVar86);
      local_ec0._0_8_ = auVar1._0_8_;
      uVar7 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar1._8_8_;
      uVar8 = local_ec0._8_8_;
      local_e30 = 0x3fb8aa3b3fb8aa3b;
      uStack_e28 = 0x3fb8aa3b3fb8aa3b;
      local_e20._0_4_ = auVar1._0_4_;
      local_e20._4_4_ = auVar1._4_4_;
      uStack_e18._0_4_ = auVar1._8_4_;
      uStack_e18._4_4_ = auVar1._12_4_;
      local_ee0._4_4_ = local_e20._4_4_ * 1.442695;
      local_ee0._0_4_ = (float)local_e20 * 1.442695;
      uStack_ed8._0_4_ = (float)uStack_e18 * 1.442695;
      uStack_ed8._4_4_ = uStack_e18._4_4_ * 1.442695;
      local_de0 = local_ee0;
      uStack_dd8 = uStack_ed8;
      local_df0 = 0x3f0000003f000000;
      uStack_de8 = 0x3f0000003f000000;
      local_ee0._0_4_ = (float)local_e20 * 1.442695 + 0.5;
      local_ee0._4_4_ = local_e20._4_4_ * 1.442695 + 0.5;
      fVar132 = (float)uStack_e18 * 1.442695 + 0.5;
      fVar133 = uStack_e18._4_4_ * 1.442695 + 0.5;
      uStack_ed8._0_4_ = fVar132;
      uStack_ed8._4_4_ = fVar133;
      local_c0 = local_ee0;
      uStack_b8 = uStack_ed8;
      local_ef0._4_4_ = (int)(float)local_ee0._4_4_;
      local_ef0._0_4_ = (int)(float)local_ee0._0_4_;
      local_ef0._8_4_ = (int)fVar132;
      local_ef0._12_4_ = (int)fVar133;
      local_910 = local_ef0._0_8_;
      uStack_908 = local_ef0._8_8_;
      auVar95._8_8_ = local_ef0._8_8_;
      auVar95._0_8_ = local_ef0._0_8_;
      auVar6 = vcvtdq2ps_avx(auVar95);
      local_ed0 = auVar6._0_8_;
      local_80 = local_ed0;
      uStack_ec8 = auVar6._8_8_;
      uStack_78 = uStack_ec8;
      local_90 = local_ee0;
      uStack_88 = uStack_ed8;
      auVar125._8_8_ = uStack_ed8;
      auVar125._0_8_ = local_ee0;
      auVar5 = vcmpps_avx(auVar125,auVar6,1);
      local_f10._0_8_ = auVar5._0_8_;
      local_9d0 = local_f10._0_8_;
      local_f10._8_8_ = auVar5._8_8_;
      uStack_9c8 = local_f10._8_8_;
      local_9e0 = 0x3f8000003f800000;
      uStack_9d8 = 0x3f8000003f800000;
      auVar90._8_8_ = 0x3f8000003f800000;
      auVar90._0_8_ = 0x3f8000003f800000;
      local_f10 = vpand_avx(auVar5,auVar90);
      local_d60 = local_ed0;
      uStack_d58 = uStack_ec8;
      local_d70 = local_f10._0_8_;
      uStack_d68 = local_f10._8_8_;
      _local_ee0 = vsubps_avx(auVar6,local_f10);
      local_678 = local_ee0;
      local_668 = ::_ps_cephes_exp_C1;
      local_838 = local_ec0;
      local_1d0 = local_ee0;
      uStack_1c8 = uStack_ed8;
      local_1e0[0] = 0.6933594;
      local_1e0[1] = 0.6933594;
      afStack_1d8[0] = 0.6933594;
      afStack_1d8[1] = 0.6933594;
      local_1f0 = local_ec0._0_8_;
      uStack_1e8 = local_ec0._8_8_;
      auVar118._8_4_ = 0.6933594;
      auVar118._12_4_ = 0.6933594;
      auVar118._0_4_ = 0.6933594;
      auVar118._4_4_ = 0.6933594;
      auVar5 = vfnmadd213ps_fma(auVar118,_local_ee0,auVar1);
      local_680 = ::_ps_cephes_exp_C2;
      local_1a0 = local_ee0;
      uStack_198 = uStack_ed8;
      local_1b0[0] = -0.00021219444;
      local_1b0[1] = -0.00021219444;
      afStack_1a8[0] = -0.00021219444;
      afStack_1a8[1] = -0.00021219444;
      local_ec0._0_8_ = auVar5._0_8_;
      local_1c0 = local_ec0._0_8_;
      local_ec0._8_8_ = auVar5._8_8_;
      uStack_1b8 = local_ec0._8_8_;
      auVar119._8_4_ = -0.00021219444;
      auVar119._12_4_ = -0.00021219444;
      auVar119._0_4_ = -0.00021219444;
      auVar119._4_4_ = -0.00021219444;
      local_ec0 = vfnmadd213ps_fma(auVar119,_local_ee0,auVar5);
      local_e50 = local_ec0._0_8_;
      uStack_e48 = local_ec0._8_8_;
      local_e40._0_4_ = local_ec0._0_4_;
      local_e40._4_4_ = local_ec0._4_4_;
      uStack_e38._0_4_ = local_ec0._8_4_;
      uStack_e38._4_4_ = local_ec0._12_4_;
      local_ed0._4_4_ = local_e40._4_4_ * local_e40._4_4_;
      local_ed0._0_4_ = (float)local_e40 * (float)local_e40;
      uStack_ec8._0_4_ = (float)uStack_e38 * (float)uStack_e38;
      uStack_ec8._4_4_ = uStack_e38._4_4_ * uStack_e38._4_4_;
      uStack_f18 = 0x3950696739506967;
      local_f20 = (undefined1  [8])0x3950696739506967;
      local_828 = local_f20;
      local_7c0 = ::_ps_cephes_exp_p1;
      local_440 = 0x3950696739506967;
      uStack_438 = 0x3950696739506967;
      local_450 = local_ec0._0_8_;
      uStack_448 = local_ec0._8_8_;
      local_460[0] = 0.0013981999;
      local_460[1] = 0.0013981999;
      afStack_458[0] = 0.0013981999;
      afStack_458[1] = 0.0013981999;
      auVar107._8_4_ = 0.0013981999;
      auVar107._12_4_ = 0.0013981999;
      auVar107._0_4_ = 0.0013981999;
      auVar107._4_4_ = 0.0013981999;
      auVar5 = vfmadd213ps_fma(local_ec0,_local_f20,auVar107);
      local_7d8 = ::_ps_cephes_exp_p2;
      local_f20 = auVar5._0_8_;
      local_410 = local_f20;
      uStack_f18 = auVar5._8_8_;
      uStack_408 = uStack_f18;
      local_420 = local_ec0._0_8_;
      uStack_418 = local_ec0._8_8_;
      local_430[0] = 0.008333452;
      local_430[1] = 0.008333452;
      afStack_428[0] = 0.008333452;
      afStack_428[1] = 0.008333452;
      auVar108._8_4_ = 0.008333452;
      auVar108._12_4_ = 0.008333452;
      auVar108._0_4_ = 0.008333452;
      auVar108._4_4_ = 0.008333452;
      auVar5 = vfmadd213ps_fma(local_ec0,auVar5,auVar108);
      local_7f0 = ::_ps_cephes_exp_p3;
      local_f20 = auVar5._0_8_;
      local_3e0 = local_f20;
      uStack_f18 = auVar5._8_8_;
      uStack_3d8 = uStack_f18;
      local_3f0 = local_ec0._0_8_;
      uStack_3e8 = local_ec0._8_8_;
      local_400[0] = 0.041665796;
      local_400[1] = 0.041665796;
      afStack_3f8[0] = 0.041665796;
      afStack_3f8[1] = 0.041665796;
      auVar109._8_4_ = 0.041665796;
      auVar109._12_4_ = 0.041665796;
      auVar109._0_4_ = 0.041665796;
      auVar109._4_4_ = 0.041665796;
      auVar5 = vfmadd213ps_fma(local_ec0,auVar5,auVar109);
      local_808 = ::_ps_cephes_exp_p4;
      local_f20 = auVar5._0_8_;
      local_3b0 = local_f20;
      uStack_f18 = auVar5._8_8_;
      uStack_3a8 = uStack_f18;
      local_3c0 = local_ec0._0_8_;
      uStack_3b8 = local_ec0._8_8_;
      local_3d0[0] = 0.16666666;
      local_3d0[1] = 0.16666666;
      afStack_3c8[0] = 0.16666666;
      afStack_3c8[1] = 0.16666666;
      auVar110._8_4_ = 0.16666666;
      auVar110._12_4_ = 0.16666666;
      auVar110._0_4_ = 0.16666666;
      auVar110._4_4_ = 0.16666666;
      auVar5 = vfmadd213ps_fma(local_ec0,auVar5,auVar110);
      local_820 = ::_ps_cephes_exp_p5;
      local_f20 = auVar5._0_8_;
      local_380 = local_f20;
      uStack_f18 = auVar5._8_8_;
      uStack_378 = uStack_f18;
      local_390 = local_ec0._0_8_;
      uStack_388 = local_ec0._8_8_;
      local_3a0[0] = 0.5;
      local_3a0[1] = 0.5;
      afStack_398[0] = 0.5;
      afStack_398[1] = 0.5;
      auVar111._8_4_ = 0.5;
      auVar111._12_4_ = 0.5;
      auVar111._0_4_ = 0.5;
      auVar111._4_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(local_ec0,auVar5,auVar111);
      local_830 = local_ed0;
      local_f20 = auVar5._0_8_;
      local_350 = local_f20;
      uStack_f18 = auVar5._8_8_;
      uStack_348 = uStack_f18;
      local_360 = local_ed0;
      uStack_358 = uStack_ec8;
      local_370 = local_ec0._0_8_;
      uStack_368 = local_ec0._8_8_;
      auVar5 = vfmadd213ps_fma(_local_ed0,auVar5,local_ec0);
      local_f20 = auVar5._0_8_;
      uVar9 = local_f20;
      uStack_f18 = auVar5._8_8_;
      uVar10 = uStack_f18;
      local_e10 = 0x3f8000003f800000;
      uStack_e08 = 0x3f8000003f800000;
      local_e00._0_4_ = auVar5._0_4_;
      local_e00._4_4_ = auVar5._4_4_;
      uStack_df8._0_4_ = auVar5._8_4_;
      uStack_df8._4_4_ = auVar5._12_4_;
      local_f20._4_4_ = local_e00._4_4_ + 1.0;
      local_f20._0_4_ = (float)local_e00 + 1.0;
      uStack_f18._0_4_ = (float)uStack_df8 + 1.0;
      uStack_f18._4_4_ = uStack_df8._4_4_ + 1.0;
      local_d0._0_4_ = local_ee0._0_4_;
      local_d0._4_4_ = local_ee0._4_4_;
      uStack_c8._0_4_ = local_ee0._8_4_;
      uStack_c8._4_4_ = local_ee0._12_4_;
      local_ef0._4_4_ = (int)local_d0._4_4_;
      local_ef0._0_4_ = (int)(float)local_d0;
      local_ef0._8_4_ = (int)(float)uStack_c8;
      local_ef0._12_4_ = (int)uStack_c8._4_4_;
      local_ea0 = local_ef0._0_8_;
      uStack_e98 = local_ef0._8_8_;
      local_1030 = 0x7f0000007f;
      uStack_1028 = 0x7f0000007f;
      auVar76._8_8_ = local_ef0._8_8_;
      auVar76._0_8_ = local_ef0._0_8_;
      auVar75._8_8_ = 0x7f0000007f;
      auVar75._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar76,auVar75);
      local_ef0._0_8_ = auVar5._0_8_;
      local_e80 = local_ef0._0_8_;
      local_ef0._8_8_ = auVar5._8_8_;
      uStack_e78 = local_ef0._8_8_;
      local_e84 = 0x17;
      local_ef0 = vpslld_avx(auVar5,ZEXT416(0x17));
      local_60 = local_ef0._0_8_;
      uStack_58 = local_ef0._8_8_;
      local_f30 = local_ef0._0_8_;
      uStack_f28 = local_ef0._8_8_;
      local_e60 = local_f20;
      uStack_e58 = uStack_f18;
      local_e70._0_4_ = local_ef0._0_4_;
      local_e70._4_4_ = local_ef0._4_4_;
      uStack_e68._0_4_ = local_ef0._8_4_;
      uStack_e68._4_4_ = local_ef0._12_4_;
      local_f20._0_4_ = ((float)local_e00 + 1.0) * (float)local_e70;
      local_f20._4_4_ = (local_e00._4_4_ + 1.0) * local_e70._4_4_;
      uStack_e68._0_4_ = ((float)uStack_df8 + 1.0) * (float)uStack_e68;
      uStack_e68._4_4_ = (uStack_df8._4_4_ + 1.0) * uStack_e68._4_4_;
      uStack_f18._0_4_ = (float)uStack_e68;
      uStack_f18._4_4_ = uStack_e68._4_4_;
      local_f40 = local_f20;
      uStack_f38 = uStack_f18;
      local_d74 = 0x3f800000;
      local_d90 = 0x3f800000;
      local_f50 = 0x3f8000003f800000;
      uStack_f48 = 0x3f8000003f800000;
      local_1060._4_4_ = (float)local_f20._4_4_ + 1.0;
      local_1060._0_4_ = (float)local_f20._0_4_ + 1.0;
      uStack_1058._0_4_ = (float)uStack_e68 + 1.0;
      uStack_1058._4_4_ = uStack_e68._4_4_ + 1.0;
      local_a80 = local_1060;
      uStack_a78 = uStack_1058;
      local_aa0 = 0;
      uStack_a98 = 0;
      local_a90 = 0;
      uStack_a88 = 0;
      auVar84._8_8_ = uStack_1058;
      auVar84._0_8_ = local_1060;
      local_1090 = vcmpps_avx(auVar84,ZEXT816(0),2);
      local_a20 = local_1060;
      uStack_a18 = uStack_1058;
      local_a30 = 0x80000000800000;
      uStack_a28 = 0x80000000800000;
      auVar88._8_8_ = uStack_1058;
      auVar88._0_8_ = local_1060;
      auVar87._8_8_ = 0x80000000800000;
      auVar87._0_8_ = 0x80000000800000;
      auVar5 = vmaxps_avx(auVar88,auVar87);
      local_1060 = auVar5._0_8_;
      local_a10 = local_1060;
      uStack_1058 = auVar5._8_8_;
      uStack_a08 = uStack_1058;
      local_1040 = local_1060;
      uStack_1038 = uStack_1058;
      local_1044 = 0x17;
      auVar1 = vpsrld_avx(auVar5,ZEXT416(0x17));
      local_970 = local_1060;
      uStack_968 = uStack_1058;
      local_980 = 0x807fffff807fffff;
      uStack_978 = 0x807fffff807fffff;
      auVar92._8_8_ = 0x807fffff807fffff;
      auVar92._0_8_ = 0x807fffff807fffff;
      auVar5 = vpand_avx(auVar5,auVar92);
      local_1060 = auVar5._0_8_;
      local_930 = local_1060;
      uStack_1058 = auVar5._8_8_;
      uStack_928 = uStack_1058;
      auVar93._8_8_ = 0x3f0000003f000000;
      auVar93._0_8_ = 0x3f0000003f000000;
      auVar6 = vpor_avx(auVar5,auVar93);
      local_1070._0_8_ = auVar1._0_8_;
      local_1020 = local_1070._0_8_;
      local_1070._8_8_ = auVar1._8_8_;
      uStack_1018 = local_1070._8_8_;
      auVar74._8_8_ = 0x7f0000007f;
      auVar74._0_8_ = 0x7f0000007f;
      local_1070 = vpsubd_avx(auVar1,auVar74);
      local_900 = local_1070._0_8_;
      uStack_8f8 = local_1070._8_8_;
      auVar5 = vcvtdq2ps_avx(local_1070);
      local_10a0 = auVar5._0_8_;
      uVar11 = local_10a0;
      uStack_1098 = auVar5._8_8_;
      uVar12 = uStack_1098;
      local_f70 = 0x3f8000003f800000;
      uStack_f68 = 0x3f8000003f800000;
      local_f60._0_4_ = auVar5._0_4_;
      local_f60._4_4_ = auVar5._4_4_;
      uStack_f58._0_4_ = auVar5._8_4_;
      uStack_f58._4_4_ = auVar5._12_4_;
      local_10a0._4_4_ = local_f60._4_4_ + 1.0;
      local_10a0._0_4_ = (float)local_f60 + 1.0;
      uStack_1098._0_4_ = (float)uStack_f58 + 1.0;
      uStack_1098._4_4_ = uStack_f58._4_4_ + 1.0;
      local_1060 = auVar6._0_8_;
      local_8e0 = local_1060;
      uStack_1058 = auVar6._8_8_;
      uStack_8d8 = uStack_1058;
      local_8f0 = 0x3f3504f33f3504f3;
      uStack_8e8 = 0x3f3504f33f3504f3;
      auVar96._8_8_ = 0x3f3504f33f3504f3;
      auVar96._0_8_ = 0x3f3504f33f3504f3;
      local_10b0 = vcmpps_avx(auVar6,auVar96,1);
      local_990 = local_1060;
      uStack_988 = uStack_1058;
      local_9a0 = local_10b0._0_8_;
      uStack_998 = local_10b0._8_8_;
      local_10c0 = vpand_avx(auVar6,local_10b0);
      local_d20 = local_1060;
      uStack_d18 = uStack_1058;
      local_d30 = 0x3f8000003f800000;
      uStack_d28 = 0x3f8000003f800000;
      auVar78._8_8_ = 0x3f8000003f800000;
      auVar78._0_8_ = 0x3f8000003f800000;
      auVar5 = vsubps_avx(auVar6,auVar78);
      local_d40 = local_10a0;
      uStack_d38 = uStack_1098;
      local_9b0 = 0x3f8000003f800000;
      uStack_9a8 = 0x3f8000003f800000;
      local_9c0 = local_10b0._0_8_;
      uStack_9b8 = local_10b0._8_8_;
      auVar91._8_8_ = 0x3f8000003f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      local_d50 = vpand_avx(local_10b0,auVar91);
      auVar77._8_8_ = uStack_1098;
      auVar77._0_8_ = local_10a0;
      _local_10a0 = vsubps_avx(auVar77,local_d50);
      local_1060 = auVar5._0_8_;
      uVar13 = local_1060;
      uStack_1058 = auVar5._8_8_;
      uVar14 = uStack_1058;
      local_f80._0_4_ = auVar5._0_4_;
      local_f80._4_4_ = auVar5._4_4_;
      uStack_f78._0_4_ = auVar5._8_4_;
      uStack_f78._4_4_ = auVar5._12_4_;
      local_f90._0_4_ = local_10c0._0_4_;
      local_f90._4_4_ = local_10c0._4_4_;
      uStack_f88._0_4_ = local_10c0._8_4_;
      uStack_f88._4_4_ = local_10c0._12_4_;
      local_1060._0_4_ = (float)local_f80 + (float)local_f90;
      local_1060._4_4_ = local_f80._4_4_ + local_f90._4_4_;
      uStack_f78._0_4_ = (float)uStack_f78 + (float)uStack_f88;
      uStack_f78._4_4_ = uStack_f78._4_4_ + uStack_f88._4_4_;
      uStack_1058._0_4_ = (float)uStack_f78;
      uStack_1058._4_4_ = uStack_f78._4_4_;
      local_fd0 = local_1060;
      uStack_fc8 = uStack_1058;
      local_10d0 = (float)local_1060._0_4_ * (float)local_1060._0_4_;
      fStack_10cc = (float)local_1060._4_4_ * (float)local_1060._4_4_;
      fStack_10c8 = (float)uStack_f78 * (float)uStack_f78;
      fStack_10c4 = uStack_f78._4_4_ * uStack_f78._4_4_;
      uStack_10d8 = 0x3d9021bb3d9021bb;
      local_10e0 = (undefined1  [8])0x3d9021bb3d9021bb;
      local_790 = local_10e0;
      local_7a8 = local_1060;
      local_6d0 = ::_ps_cephes_log_p1;
      local_620 = 0x3d9021bb3d9021bb;
      uStack_618 = 0x3d9021bb3d9021bb;
      local_630 = local_1060;
      uStack_628 = uStack_1058;
      local_640[0] = -0.1151461;
      local_640[1] = -0.1151461;
      afStack_638[0] = -0.1151461;
      afStack_638[1] = -0.1151461;
      auVar97._8_4_ = -0.1151461;
      auVar97._12_4_ = -0.1151461;
      auVar97._0_4_ = -0.1151461;
      auVar97._4_4_ = -0.1151461;
      auVar5 = vfmadd213ps_fma(_local_1060,_local_10e0,auVar97);
      local_6e8 = ::_ps_cephes_log_p2;
      local_10e0 = auVar5._0_8_;
      local_5f0 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_5e8 = uStack_10d8;
      local_600 = local_1060;
      uStack_5f8 = uStack_1058;
      local_610[0] = 0.116769984;
      local_610[1] = 0.116769984;
      afStack_608[0] = 0.116769984;
      afStack_608[1] = 0.116769984;
      auVar98._8_4_ = 0.116769984;
      auVar98._12_4_ = 0.116769984;
      auVar98._0_4_ = 0.116769984;
      auVar98._4_4_ = 0.116769984;
      auVar5 = vfmadd213ps_fma(_local_1060,auVar5,auVar98);
      local_700 = ::_ps_cephes_log_p3;
      local_10e0 = auVar5._0_8_;
      local_5c0 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_5b8 = uStack_10d8;
      local_5d0 = local_1060;
      uStack_5c8 = uStack_1058;
      local_5e0[0] = -0.12420141;
      local_5e0[1] = -0.12420141;
      afStack_5d8[0] = -0.12420141;
      afStack_5d8[1] = -0.12420141;
      auVar99._8_4_ = -0.12420141;
      auVar99._12_4_ = -0.12420141;
      auVar99._0_4_ = -0.12420141;
      auVar99._4_4_ = -0.12420141;
      auVar5 = vfmadd213ps_fma(_local_1060,auVar5,auVar99);
      local_718 = ::_ps_cephes_log_p4;
      local_10e0 = auVar5._0_8_;
      local_590 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_588 = uStack_10d8;
      local_5a0 = local_1060;
      uStack_598 = uStack_1058;
      local_5b0[0] = 0.14249323;
      local_5b0[1] = 0.14249323;
      afStack_5a8[0] = 0.14249323;
      afStack_5a8[1] = 0.14249323;
      auVar100._8_4_ = 0.14249323;
      auVar100._12_4_ = 0.14249323;
      auVar100._0_4_ = 0.14249323;
      auVar100._4_4_ = 0.14249323;
      auVar5 = vfmadd213ps_fma(_local_1060,auVar5,auVar100);
      local_730 = ::_ps_cephes_log_p5;
      local_10e0 = auVar5._0_8_;
      local_560 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_558 = uStack_10d8;
      local_570 = local_1060;
      uStack_568 = uStack_1058;
      local_580[0] = -0.16668057;
      local_580[1] = -0.16668057;
      afStack_578[0] = -0.16668057;
      afStack_578[1] = -0.16668057;
      auVar101._8_4_ = -0.16668057;
      auVar101._12_4_ = -0.16668057;
      auVar101._0_4_ = -0.16668057;
      auVar101._4_4_ = -0.16668057;
      auVar5 = vfmadd213ps_fma(_local_1060,auVar5,auVar101);
      local_748 = ::_ps_cephes_log_p6;
      local_10e0 = auVar5._0_8_;
      local_530 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_528 = uStack_10d8;
      local_540 = local_1060;
      uStack_538 = uStack_1058;
      local_550[0] = 0.20000714;
      local_550[1] = 0.20000714;
      afStack_548[0] = 0.20000714;
      afStack_548[1] = 0.20000714;
      auVar102._8_4_ = 0.20000714;
      auVar102._12_4_ = 0.20000714;
      auVar102._0_4_ = 0.20000714;
      auVar102._4_4_ = 0.20000714;
      auVar5 = vfmadd213ps_fma(_local_1060,auVar5,auVar102);
      local_760 = ::_ps_cephes_log_p7;
      local_10e0 = auVar5._0_8_;
      local_500 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_4f8 = uStack_10d8;
      local_510 = local_1060;
      uStack_508 = uStack_1058;
      local_520[0] = -0.24999994;
      local_520[1] = -0.24999994;
      afStack_518[0] = -0.24999994;
      afStack_518[1] = -0.24999994;
      auVar103._8_4_ = -0.24999994;
      auVar103._12_4_ = -0.24999994;
      auVar103._0_4_ = -0.24999994;
      auVar103._4_4_ = -0.24999994;
      auVar5 = vfmadd213ps_fma(_local_1060,auVar5,auVar103);
      local_778 = ::_ps_cephes_log_p8;
      local_10e0 = auVar5._0_8_;
      local_4d0 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_4c8 = uStack_10d8;
      local_4e0 = local_1060;
      uStack_4d8 = uStack_1058;
      local_4f0[0] = 0.3333333;
      local_4f0[1] = 0.3333333;
      afStack_4e8[0] = 0.3333333;
      afStack_4e8[1] = 0.3333333;
      auVar104._8_4_ = 0.3333333;
      auVar104._12_4_ = 0.3333333;
      auVar104._0_4_ = 0.3333333;
      auVar104._4_4_ = 0.3333333;
      auVar5 = vfmadd213ps_fma(_local_1060,auVar5,auVar104);
      local_10e0 = auVar5._0_8_;
      uVar15 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uVar16 = uStack_10d8;
      local_ff0 = local_1060;
      uStack_fe8 = uStack_1058;
      local_fe0._0_4_ = auVar5._0_4_;
      local_fe0._4_4_ = auVar5._4_4_;
      uStack_fd8._0_4_ = auVar5._8_4_;
      uStack_fd8._4_4_ = auVar5._12_4_;
      local_10e0._4_4_ = local_fe0._4_4_ * (float)local_1060._4_4_;
      local_10e0._0_4_ = (float)local_fe0 * (float)local_1060._0_4_;
      uStack_10d8._0_4_ = (float)uStack_fd8 * (float)uStack_f78;
      uStack_10d8._4_4_ = uStack_fd8._4_4_ * uStack_f78._4_4_;
      local_1000 = local_10e0;
      uStack_ff8 = uStack_10d8;
      local_1010 = CONCAT44(fStack_10cc,local_10d0);
      uStack_1008 = CONCAT44(fStack_10c4,fStack_10c8);
      local_10e0._4_4_ = local_fe0._4_4_ * (float)local_1060._4_4_ * fStack_10cc;
      local_10e0._0_4_ = (float)local_fe0 * (float)local_1060._0_4_ * local_10d0;
      uStack_10d8._0_4_ = (float)uStack_fd8 * (float)uStack_f78 * fStack_10c8;
      uStack_10d8._4_4_ = uStack_fd8._4_4_ * uStack_f78._4_4_ * fStack_10c4;
      local_798 = local_10a0;
      local_788 = ::_ps_cephes_log_q1;
      local_4a0 = local_10a0;
      uStack_498 = uStack_1098;
      local_4b0[0] = -0.00021219444;
      local_4b0[1] = -0.00021219444;
      afStack_4a8[0] = -0.00021219444;
      afStack_4a8[1] = -0.00021219444;
      local_4c0 = local_10e0;
      uStack_4b8 = uStack_10d8;
      auVar105._8_4_ = -0.00021219444;
      auVar105._12_4_ = -0.00021219444;
      auVar105._0_4_ = -0.00021219444;
      auVar105._4_4_ = -0.00021219444;
      auVar5 = vfmadd213ps_fma(auVar105,_local_10a0,_local_10e0);
      local_648 = &local_10d0;
      local_650 = ::_ps_0p5;
      local_200 = CONCAT44(fStack_10cc,local_10d0);
      uStack_1f8 = CONCAT44(fStack_10c4,fStack_10c8);
      auVar129._4_4_ = fStack_10cc;
      auVar129._0_4_ = local_10d0;
      auVar129._8_4_ = fStack_10c8;
      auVar129._12_4_ = fStack_10c4;
      local_210[0] = 0.5;
      local_210[1] = 0.5;
      afStack_208[0] = 0.5;
      afStack_208[1] = 0.5;
      local_10e0 = auVar5._0_8_;
      local_220 = local_10e0;
      uStack_10d8 = auVar5._8_8_;
      uStack_218 = uStack_10d8;
      auVar117._8_4_ = 0.5;
      auVar117._12_4_ = 0.5;
      auVar117._0_4_ = 0.5;
      auVar117._4_4_ = 0.5;
      _local_10e0 = vfnmadd213ps_fma(auVar117,auVar129,auVar5);
      local_fa0 = local_1060;
      uStack_f98 = uStack_1058;
      local_fb0._0_4_ = local_10e0._0_4_;
      local_fb0._4_4_ = local_10e0._4_4_;
      uStack_fa8._0_4_ = local_10e0._8_4_;
      uStack_fa8._4_4_ = local_10e0._12_4_;
      local_1060._4_4_ = (float)local_1060._4_4_ + local_fb0._4_4_;
      local_1060._0_4_ = (float)local_1060._0_4_ + (float)local_fb0;
      uStack_1058._0_4_ = (float)uStack_f78 + (float)uStack_fa8;
      uStack_1058._4_4_ = uStack_f78._4_4_ + uStack_fa8._4_4_;
      local_7a0 = ::_ps_cephes_log_q2;
      local_470 = local_10a0;
      uStack_468 = uStack_1098;
      local_480[0] = 0.6933594;
      local_480[1] = 0.6933594;
      afStack_478[0] = 0.6933594;
      afStack_478[1] = 0.6933594;
      local_490 = local_1060;
      uStack_488 = uStack_1058;
      auVar106._8_4_ = 0.6933594;
      auVar106._12_4_ = 0.6933594;
      auVar106._0_4_ = 0.6933594;
      auVar106._4_4_ = 0.6933594;
      auVar5 = vfmadd213ps_fma(auVar106,_local_10a0,_local_1060);
      local_1060 = auVar5._0_8_;
      local_950 = local_1060;
      uStack_1058 = auVar5._8_8_;
      uStack_948 = uStack_1058;
      local_960 = local_1090._0_8_;
      uStack_958 = local_1090._8_8_;
      _local_1060 = vpor_avx(auVar5,local_1090);
      local_1130 = local_1060;
      uStack_1128 = uStack_1058;
      local_d94 = 0x3f800000;
      local_db0 = 0x3f800000;
      local_1140 = 0x3f8000003f800000;
      uStack_1138 = 0x3f8000003f800000;
      local_db4 = 0x40000000;
      local_dd0 = 0x40000000;
      local_1150 = 0x4000000040000000;
      uStack_1148 = 0x4000000040000000;
      local_10f0._0_4_ = local_1060._0_4_;
      local_10f0._4_4_ = local_1060._4_4_;
      uStack_10e8._0_4_ = local_1060._8_4_;
      uStack_10e8._4_4_ = local_1060._12_4_;
      local_ce0 = (float)local_10f0 * 2.0;
      fStack_cdc = local_10f0._4_4_ * 2.0;
      fStack_cd8 = (float)uStack_10e8 * 2.0;
      fStack_cd4 = uStack_10e8._4_4_ * 2.0;
      local_b34 = 0x3f800000;
      local_b50 = 0x3f800000;
      local_cf0 = 0x3f8000003f800000;
      uStack_ce8 = 0x3f8000003f800000;
      local_cc0._8_8_ = 0x3f8000003f800000;
      local_cc0._0_8_ = 0x3f8000003f800000;
      local_ac0 = 0;
      uStack_ab8 = 0;
      local_b00 = 0;
      uStack_af8 = 0;
      local_b10 = CONCAT44(fStack_cdc,local_ce0);
      uStack_b08 = CONCAT44(fStack_cd4,fStack_cd8);
      auVar82._8_8_ = uStack_b08;
      auVar82._0_8_ = local_b10;
      auVar5 = vsubps_avx(ZEXT816(0),auVar82);
      local_ad0 = 0;
      uStack_ac8 = 0;
      local_c40._0_8_ = auVar5._0_8_;
      local_120 = local_c40._0_8_;
      local_c40._8_8_ = auVar5._8_8_;
      uStack_118 = local_c40._8_8_;
      auVar122._8_8_ = 0x42b0c0a542b0c0a5;
      auVar122._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar5,auVar122);
      local_c40._0_8_ = auVar5._0_8_;
      local_a60 = local_c40._0_8_;
      local_c40._8_8_ = auVar5._8_8_;
      uStack_a58 = local_c40._8_8_;
      auVar85._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar1 = vmaxps_avx(auVar85,auVar5);
      local_c40._0_8_ = auVar1._0_8_;
      uVar17 = local_c40._0_8_;
      local_c40._8_8_ = auVar1._8_8_;
      uVar18 = local_c40._8_8_;
      local_ba0._0_4_ = auVar1._0_4_;
      local_ba0._4_4_ = auVar1._4_4_;
      uStack_b98._0_4_ = auVar1._8_4_;
      uStack_b98._4_4_ = auVar1._12_4_;
      local_c60._4_4_ = local_ba0._4_4_ * 1.442695;
      local_c60._0_4_ = (float)local_ba0 * 1.442695;
      uStack_c58._0_4_ = (float)uStack_b98 * 1.442695;
      uStack_c58._4_4_ = uStack_b98._4_4_ * 1.442695;
      local_b60 = local_c60;
      uStack_b58 = uStack_c58;
      local_c60._0_4_ = (float)local_ba0 * 1.442695 + 0.5;
      local_c60._4_4_ = local_ba0._4_4_ * 1.442695 + 0.5;
      fVar132 = (float)uStack_b98 * 1.442695 + 0.5;
      fVar133 = uStack_b98._4_4_ * 1.442695 + 0.5;
      uStack_c58._0_4_ = fVar132;
      uStack_c58._4_4_ = fVar133;
      local_e0 = local_c60;
      uStack_d8 = uStack_c58;
      local_c70._4_4_ = (int)(float)local_c60._4_4_;
      local_c70._0_4_ = (int)(float)local_c60._0_4_;
      local_c70._8_4_ = (int)fVar132;
      local_c70._12_4_ = (int)fVar133;
      local_920 = local_c70._0_8_;
      uStack_918 = local_c70._8_8_;
      auVar94._8_8_ = local_c70._8_8_;
      auVar94._0_8_ = local_c70._0_8_;
      auVar6 = vcvtdq2ps_avx(auVar94);
      local_c50 = auVar6._0_8_;
      local_a0 = local_c50;
      uStack_c48 = auVar6._8_8_;
      uStack_98 = uStack_c48;
      local_b0 = local_c60;
      uStack_a8 = uStack_c58;
      auVar124._8_8_ = uStack_c58;
      auVar124._0_8_ = local_c60;
      auVar5 = vcmpps_avx(auVar124,auVar6,1);
      local_c90._0_8_ = auVar5._0_8_;
      local_9f0 = local_c90._0_8_;
      local_c90._8_8_ = auVar5._8_8_;
      uStack_9e8 = local_c90._8_8_;
      local_a00 = 0x3f8000003f800000;
      uStack_9f8 = 0x3f8000003f800000;
      auVar89._8_8_ = 0x3f8000003f800000;
      auVar89._0_8_ = 0x3f8000003f800000;
      local_c90 = vpand_avx(auVar5,auVar89);
      local_b20 = local_c50;
      uStack_b18 = uStack_c48;
      local_b30 = local_c90._0_8_;
      uStack_b28 = local_c90._8_8_;
      _local_c60 = vsubps_avx(auVar6,local_c90);
      local_6a8 = local_c60;
      local_698 = ::_ps_cephes_exp_C1;
      local_8c8 = local_c40;
      local_170 = local_c60;
      uStack_168 = uStack_c58;
      local_180[0] = 0.6933594;
      local_180[1] = 0.6933594;
      afStack_178[0] = 0.6933594;
      afStack_178[1] = 0.6933594;
      local_190 = local_c40._0_8_;
      uStack_188 = local_c40._8_8_;
      auVar120._8_4_ = 0.6933594;
      auVar120._12_4_ = 0.6933594;
      auVar120._0_4_ = 0.6933594;
      auVar120._4_4_ = 0.6933594;
      auVar5 = vfnmadd213ps_fma(auVar120,_local_c60,auVar1);
      local_6b0 = ::_ps_cephes_exp_C2;
      local_140 = local_c60;
      uStack_138 = uStack_c58;
      local_150[0] = -0.00021219444;
      local_150[1] = -0.00021219444;
      afStack_148[0] = -0.00021219444;
      afStack_148[1] = -0.00021219444;
      local_c40._0_8_ = auVar5._0_8_;
      local_160 = local_c40._0_8_;
      local_c40._8_8_ = auVar5._8_8_;
      uStack_158 = local_c40._8_8_;
      auVar121._8_4_ = -0.00021219444;
      auVar121._12_4_ = -0.00021219444;
      auVar121._0_4_ = -0.00021219444;
      auVar121._4_4_ = -0.00021219444;
      local_c40 = vfnmadd213ps_fma(auVar121,_local_c60,auVar5);
      local_bd0 = local_c40._0_8_;
      uStack_bc8 = local_c40._8_8_;
      local_bc0._0_4_ = local_c40._0_4_;
      local_bc0._4_4_ = local_c40._4_4_;
      uStack_bb8._0_4_ = local_c40._8_4_;
      uStack_bb8._4_4_ = local_c40._12_4_;
      local_c50._4_4_ = local_bc0._4_4_ * local_bc0._4_4_;
      local_c50._0_4_ = (float)local_bc0 * (float)local_bc0;
      uStack_c48._0_4_ = (float)uStack_bb8 * (float)uStack_bb8;
      uStack_c48._4_4_ = uStack_bb8._4_4_ * uStack_bb8._4_4_;
      uStack_c98 = 0x3950696739506967;
      local_ca0 = (undefined1  [8])0x3950696739506967;
      local_8b8 = local_ca0;
      local_850 = ::_ps_cephes_exp_p1;
      local_320 = 0x3950696739506967;
      uStack_318 = 0x3950696739506967;
      local_330 = local_c40._0_8_;
      uStack_328 = local_c40._8_8_;
      local_340[0] = 0.0013981999;
      local_340[1] = 0.0013981999;
      afStack_338[0] = 0.0013981999;
      afStack_338[1] = 0.0013981999;
      auVar112._8_4_ = 0.0013981999;
      auVar112._12_4_ = 0.0013981999;
      auVar112._0_4_ = 0.0013981999;
      auVar112._4_4_ = 0.0013981999;
      auVar5 = vfmadd213ps_fma(local_c40,_local_ca0,auVar112);
      local_868 = ::_ps_cephes_exp_p2;
      local_ca0 = auVar5._0_8_;
      local_2f0 = local_ca0;
      uStack_c98 = auVar5._8_8_;
      uStack_2e8 = uStack_c98;
      local_300 = local_c40._0_8_;
      uStack_2f8 = local_c40._8_8_;
      local_310[0] = 0.008333452;
      local_310[1] = 0.008333452;
      afStack_308[0] = 0.008333452;
      afStack_308[1] = 0.008333452;
      auVar113._8_4_ = 0.008333452;
      auVar113._12_4_ = 0.008333452;
      auVar113._0_4_ = 0.008333452;
      auVar113._4_4_ = 0.008333452;
      auVar5 = vfmadd213ps_fma(local_c40,auVar5,auVar113);
      local_880 = ::_ps_cephes_exp_p3;
      local_ca0 = auVar5._0_8_;
      local_2c0 = local_ca0;
      uStack_c98 = auVar5._8_8_;
      uStack_2b8 = uStack_c98;
      local_2d0 = local_c40._0_8_;
      uStack_2c8 = local_c40._8_8_;
      local_2e0[0] = 0.041665796;
      local_2e0[1] = 0.041665796;
      afStack_2d8[0] = 0.041665796;
      afStack_2d8[1] = 0.041665796;
      auVar114._8_4_ = 0.041665796;
      auVar114._12_4_ = 0.041665796;
      auVar114._0_4_ = 0.041665796;
      auVar114._4_4_ = 0.041665796;
      auVar5 = vfmadd213ps_fma(local_c40,auVar5,auVar114);
      local_898 = ::_ps_cephes_exp_p4;
      local_ca0 = auVar5._0_8_;
      local_290 = local_ca0;
      uStack_c98 = auVar5._8_8_;
      uStack_288 = uStack_c98;
      local_2a0 = local_c40._0_8_;
      uStack_298 = local_c40._8_8_;
      local_2b0[0] = 0.16666666;
      local_2b0[1] = 0.16666666;
      afStack_2a8[0] = 0.16666666;
      afStack_2a8[1] = 0.16666666;
      auVar115._8_4_ = 0.16666666;
      auVar115._12_4_ = 0.16666666;
      auVar115._0_4_ = 0.16666666;
      auVar115._4_4_ = 0.16666666;
      auVar5 = vfmadd213ps_fma(local_c40,auVar5,auVar115);
      local_8b0 = ::_ps_cephes_exp_p5;
      local_ca0 = auVar5._0_8_;
      local_260 = local_ca0;
      uStack_c98 = auVar5._8_8_;
      uStack_258 = uStack_c98;
      local_270 = local_c40._0_8_;
      uStack_268 = local_c40._8_8_;
      local_280[0] = 0.5;
      local_280[1] = 0.5;
      afStack_278[0] = 0.5;
      afStack_278[1] = 0.5;
      auVar116._8_4_ = 0.5;
      auVar116._12_4_ = 0.5;
      auVar116._0_4_ = 0.5;
      auVar116._4_4_ = 0.5;
      auVar5 = vfmadd213ps_fma(local_c40,auVar5,auVar116);
      local_8c0 = local_c50;
      local_ca0 = auVar5._0_8_;
      local_230 = local_ca0;
      uStack_c98 = auVar5._8_8_;
      uStack_228 = uStack_c98;
      local_240 = local_c50;
      uStack_238 = uStack_c48;
      local_250 = local_c40._0_8_;
      uStack_248 = local_c40._8_8_;
      auVar5 = vfmadd213ps_fma(_local_c50,auVar5,local_c40);
      local_ca0 = auVar5._0_8_;
      uVar19 = local_ca0;
      uStack_c98 = auVar5._8_8_;
      uVar20 = uStack_c98;
      local_b90 = 0x3f8000003f800000;
      uStack_b88 = 0x3f8000003f800000;
      local_b80._0_4_ = auVar5._0_4_;
      local_b80._4_4_ = auVar5._4_4_;
      uStack_b78._0_4_ = auVar5._8_4_;
      uStack_b78._4_4_ = auVar5._12_4_;
      local_ca0._4_4_ = local_b80._4_4_ + 1.0;
      local_ca0._0_4_ = (float)local_b80 + 1.0;
      uStack_c98._0_4_ = (float)uStack_b78 + 1.0;
      uStack_c98._4_4_ = uStack_b78._4_4_ + 1.0;
      local_f0._0_4_ = local_c60._0_4_;
      local_f0._4_4_ = local_c60._4_4_;
      uStack_e8._0_4_ = local_c60._8_4_;
      uStack_e8._4_4_ = local_c60._12_4_;
      local_c70._4_4_ = (int)local_f0._4_4_;
      local_c70._0_4_ = (int)(float)local_f0;
      local_c70._8_4_ = (int)(float)uStack_e8;
      local_c70._12_4_ = (int)uStack_e8._4_4_;
      local_c20 = local_c70._0_8_;
      uStack_c18 = local_c70._8_8_;
      auVar81._8_8_ = local_c70._8_8_;
      auVar81._0_8_ = local_c70._0_8_;
      auVar80._8_8_ = 0x7f0000007f;
      auVar80._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar81,auVar80);
      local_c70._0_8_ = auVar5._0_8_;
      local_c00 = local_c70._0_8_;
      local_c70._8_8_ = auVar5._8_8_;
      uStack_bf8 = local_c70._8_8_;
      local_c04 = 0x17;
      local_c70 = vpslld_avx(auVar5,ZEXT416(0x17));
      local_70 = local_c70._0_8_;
      uStack_68 = local_c70._8_8_;
      local_cb0 = local_c70._0_8_;
      uStack_ca8 = local_c70._8_8_;
      local_be0 = _local_ca0;
      local_bf0._0_4_ = local_c70._0_4_;
      local_bf0._4_4_ = local_c70._4_4_;
      uStack_be8._0_4_ = local_c70._8_4_;
      uStack_be8._4_4_ = local_c70._12_4_;
      local_ca0._0_4_ = ((float)local_b80 + 1.0) * (float)local_bf0;
      local_ca0._4_4_ = (local_b80._4_4_ + 1.0) * local_bf0._4_4_;
      uStack_be8._0_4_ = ((float)uStack_b78 + 1.0) * (float)uStack_be8;
      uStack_be8._4_4_ = (uStack_b78._4_4_ + 1.0) * uStack_be8._4_4_;
      uStack_c98._0_4_ = (float)uStack_be8;
      uStack_c98._4_4_ = uStack_be8._4_4_;
      local_cd0 = local_ca0;
      uStack_cc8 = uStack_c98;
      local_af0 = (float)local_ca0._0_4_ + 1.0;
      fStack_aec = (float)local_ca0._4_4_ + 1.0;
      fStack_ae8 = (float)uStack_be8 + 1.0;
      fStack_ae4 = uStack_be8._4_4_ + 1.0;
      auVar83._4_4_ = fStack_aec;
      auVar83._0_4_ = local_af0;
      auVar83._8_4_ = fStack_ae8;
      auVar83._12_4_ = fStack_ae4;
      _local_1110 = vdivps_avx(local_cc0,auVar83);
      local_d00._0_4_ = (float)local_1110._0_4_ * 2.0;
      local_d00._4_4_ = (float)local_1110._4_4_ * 2.0;
      local_d00._8_4_ = fStack_1108 * 2.0;
      local_d00._12_4_ = fStack_1104 * 2.0;
      auVar79._8_8_ = 0x3f8000003f800000;
      auVar79._0_8_ = 0x3f8000003f800000;
      _local_1170 = vsubps_avx(local_d00,auVar79);
      local_1160._0_4_ = (undefined4)local_35c0;
      local_1160._4_4_ = (undefined4)((ulong)local_35c0 >> 0x20);
      fStack_1158 = (float)uStack_35b8;
      fStack_1154 = (float)((ulong)uStack_35b8 >> 0x20);
      local_3730 = CONCAT44((float)local_1160._4_4_ * (float)local_1170._4_4_,
                            (float)local_1160._0_4_ * (float)local_1170._0_4_);
      uStack_3728 = CONCAT44(fStack_1154 * fStack_1164,fStack_1158 * fStack_1168);
      local_3598 = local_36a0;
      local_35b0 = local_3730;
      uStack_35a8 = uStack_3728;
      auVar23._8_8_ = uStack_3728;
      auVar23._0_8_ = local_3730;
      *(undefined1 (*) [16])*local_36a0 = auVar23;
      local_36a0 = (undefined1 (*) [32])(*local_36a0 + 0x10);
      _local_1160 = auVar67;
      local_1120 = local_1150;
      uStack_1118 = uStack_1148;
      local_1100 = local_1150;
      uStack_10f8 = uStack_1148;
      local_10f0 = local_1060;
      uStack_10e8 = uStack_1058;
      local_fe0 = uVar15;
      uStack_fd8 = uVar16;
      local_fc0 = local_fd0;
      uStack_fb8 = uStack_fc8;
      local_fb0 = local_10e0;
      uStack_fa8 = uStack_10d8;
      local_f90 = local_10c0._0_8_;
      uStack_f88 = local_10c0._8_8_;
      local_f80 = uVar13;
      uStack_f78 = uVar14;
      local_f60 = uVar11;
      uStack_f58 = uVar12;
      local_f00 = local_1080;
      uStack_ef8 = uStack_1078;
      local_eb0 = local_1030;
      uStack_ea8 = uStack_1028;
      local_e70 = local_ef0._0_8_;
      uStack_e68 = local_ef0._8_8_;
      local_e40 = local_e50;
      uStack_e38 = uStack_e48;
      local_e20 = uVar7;
      uStack_e18 = uVar8;
      local_e00 = uVar9;
      uStack_df8 = uVar10;
      uStack_dcc = local_dd0;
      uStack_dc8 = local_dd0;
      uStack_dc4 = local_dd0;
      uStack_dac = local_db0;
      uStack_da8 = local_db0;
      uStack_da4 = local_db0;
      uStack_d8c = local_d90;
      uStack_d88 = local_d90;
      uStack_d84 = local_d90;
      local_d10 = local_1140;
      uStack_d08 = uStack_1138;
      local_c80 = local_1080;
      uStack_c78 = uStack_1078;
      local_c30 = local_1030;
      uStack_c28 = uStack_1028;
      local_bf0 = local_c70._0_8_;
      uStack_be8 = local_c70._8_8_;
      local_bc0 = local_bd0;
      uStack_bb8 = uStack_bc8;
      local_bb0 = local_e30;
      uStack_ba8 = uStack_e28;
      local_ba0 = uVar17;
      uStack_b98 = uVar18;
      local_b80 = uVar19;
      uStack_b78 = uVar20;
      local_b70 = local_df0;
      uStack_b68 = uStack_de8;
      uStack_b4c = local_b50;
      uStack_b48 = local_b50;
      uStack_b44 = local_b50;
      local_ae0 = local_cc0;
      local_a50 = local_a70;
      uStack_a48 = uStack_a68;
      local_940 = local_df0;
      uStack_938 = uStack_de8;
      local_8a8 = local_8c8;
      local_8a0 = local_8b8;
      local_890 = local_8c8;
      local_888 = local_8b8;
      local_878 = local_8c8;
      local_870 = local_8b8;
      local_860 = local_8c8;
      local_858 = local_8b8;
      local_848 = local_8c8;
      local_840 = local_8b8;
      local_818 = local_838;
      local_810 = local_828;
      local_800 = local_838;
      local_7f8 = local_828;
      local_7e8 = local_838;
      local_7e0 = local_828;
      local_7d0 = local_838;
      local_7c8 = local_828;
      local_7b8 = local_838;
      local_7b0 = local_828;
      local_780 = local_798;
      local_770 = local_7a8;
      local_768 = local_790;
      local_758 = local_7a8;
      local_750 = local_790;
      local_740 = local_7a8;
      local_738 = local_790;
      local_728 = local_7a8;
      local_720 = local_790;
      local_710 = local_7a8;
      local_708 = local_790;
      local_6f8 = local_7a8;
      local_6f0 = local_790;
      local_6e0 = local_7a8;
      local_6d8 = local_790;
      local_6c8 = local_7a8;
      local_6c0 = local_790;
      local_6b8 = local_8c8;
      local_6a0 = local_8c8;
      local_690 = local_6a8;
      local_688 = local_838;
      local_670 = local_838;
      local_660 = local_678;
      local_658 = local_790;
      local_110 = local_130;
      uStack_108 = uStack_128;
      local_100 = local_35c0;
      uStack_f8 = uStack_35b8;
      local_f0 = local_c60;
      uStack_e8 = uStack_c58;
      local_d0 = local_ee0;
      uStack_c8 = uStack_ed8;
    }
    for (; local_36f8 < local_3690; local_36f8 = local_36f8 + 1) {
      fVar132 = *(float *)*local_36a0;
      fVar133 = expf(*(float *)*local_36a0);
      fVar133 = logf(fVar133 + 1.0);
      fVar133 = tanhf(fVar133);
      *(float *)*local_36a0 = fVar132 * fVar133;
      local_36a0 = (undefined1 (*) [32])(*local_36a0 + 4);
    }
  }
  return 0;
}

Assistant:

int Mish_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}